

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx512_functor::binary_op_atan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  __m512 x;
  __m512 x_00;
  __m512 x_01;
  __m512 y;
  __m512 y_00;
  __m512 y_01;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  int in_ECX;
  undefined1 (*in_RDX) [64];
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar126;
  float fVar127;
  undefined8 uVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined8 uVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined8 uVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined8 uVar143;
  undefined8 uVar144;
  undefined8 uVar145;
  undefined8 uVar146;
  undefined8 uVar147;
  __m128 _outp_5;
  __m128 _b_5;
  __m128 _p_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m256 _p_4;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_3;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m256 _p_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_atan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 special_result_1;
  __m256 negative_mask_full_x_1;
  __m256 normal_result_1;
  __m256 pi_additions_1;
  __m256 negative_mask_y_1;
  __m256 negative_mask_x_1;
  __m256 normal_mode_1;
  __m256 not_equal_zero_y_1;
  __m256 not_equal_zero_x_1;
  __m256 magic_half_pi_2;
  __m256 magic_pi_1;
  __m256 magic_negative_zero_2;
  __m256 magic_zero_1;
  __m256 output_approx_1;
  __m256 fourth_power_of_input_approx_1;
  __m256 square_of_input_approx_1;
  __m256 input_approx_1;
  __m256 is_small_input_1;
  __m256 absolute_1;
  __m256 negative_mask_1;
  __m256 magic_a8_1;
  __m256 magic_a7_1;
  __m256 magic_a6_1;
  __m256 magic_a5_1;
  __m256 magic_a4_1;
  __m256 magic_a3_1;
  __m256 magic_a2_1;
  __m256 magic_a1_1;
  __m256 magic_a0_1;
  __m256 magic_half_pi_3;
  __m256 magic_negative_one_1;
  __m256 magic_one_1;
  __m256 magic_negative_zero_3;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_2;
  __m128 negative_mask_full_x_2;
  __m128 normal_result_2;
  __m128 pi_additions_2;
  __m128 negative_mask_y_2;
  __m128 negative_mask_x_2;
  __m128 normal_mode_2;
  __m128 not_equal_zero_y_2;
  __m128 not_equal_zero_x_2;
  __m128 magic_half_pi_4;
  __m128 magic_pi_2;
  __m128 magic_negative_zero_4;
  __m128 magic_zero_2;
  __m128 output_approx_2;
  __m128 fourth_power_of_input_approx_2;
  __m128 square_of_input_approx_2;
  __m128 input_approx_2;
  __m128 is_small_input_2;
  __m128 absolute_2;
  __m128 negative_mask_2;
  __m128 magic_a8_2;
  __m128 magic_a7_2;
  __m128 magic_a6_2;
  __m128 magic_a5_2;
  __m128 magic_a4_2;
  __m128 magic_a3_2;
  __m128 magic_a2_2;
  __m128 magic_a1_2;
  __m128 magic_a0_2;
  __m128 magic_half_pi_5;
  __m128 magic_negative_one_2;
  __m128 magic_one_2;
  __m128 magic_negative_zero_5;
  undefined8 local_42b0;
  undefined8 uStackY_42a8;
  undefined8 local_4280;
  undefined8 uStackY_4278;
  undefined8 uStackY_4270;
  undefined8 uStackY_4268;
  undefined1 local_41c0 [64];
  undefined8 local_4180;
  undefined8 uStackY_4178;
  undefined8 uStackY_4170;
  undefined8 uStackY_4168;
  undefined8 local_4160;
  undefined8 uStackY_4158;
  undefined8 uStackY_4150;
  undefined8 uStackY_4148;
  undefined8 local_4140;
  undefined8 uStackY_4138;
  undefined8 local_4130;
  undefined8 uStackY_4128;
  undefined8 local_4120;
  undefined8 uStackY_4118;
  undefined8 local_4110;
  undefined8 uStackY_4108;
  undefined8 local_4100;
  undefined8 uStackY_40f8;
  undefined8 uStackY_40f0;
  undefined8 uStackY_40e8;
  undefined8 uStackY_40e0;
  undefined8 uStackY_40d8;
  undefined8 uStackY_40d0;
  undefined8 in_stack_ffffffffffffbf38;
  undefined1 in_stack_ffffffffffffbf40 [28];
  undefined4 in_stack_ffffffffffffbf5c;
  int iVar148;
  undefined8 in_stack_ffffffffffffbf60;
  undefined8 in_stack_ffffffffffffbf68;
  undefined8 in_stack_ffffffffffffbf70;
  undefined8 in_stack_ffffffffffffbf78;
  undefined8 in_stack_ffffffffffffbf80;
  undefined8 in_stack_ffffffffffffbf88;
  undefined8 in_stack_ffffffffffffbf90;
  undefined8 in_stack_ffffffffffffbf98;
  undefined8 in_stack_ffffffffffffbfa0;
  undefined8 in_stack_ffffffffffffbfa8;
  undefined8 in_stack_ffffffffffffbfb0;
  undefined1 local_4000 [64];
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 uStack_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  int local_3f04;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 uStack_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 uStack_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 uStack_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  int local_3e40;
  undefined1 local_3e39;
  int local_3e38;
  int local_3e34;
  undefined1 (*local_3e30) [64];
  uint *local_3e28;
  undefined1 (*local_3e20) [32];
  undefined1 (*local_3e18) [32];
  undefined1 (*local_3e10) [32];
  undefined1 (*local_3e08) [32];
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 uStack_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined1 (*local_3d88) [64];
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 uStack_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined1 (*local_3d08) [64];
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  undefined8 uStack_3ce0;
  undefined8 uStack_3cd8;
  undefined8 uStack_3cd0;
  undefined8 uStack_3cc8;
  undefined1 (*local_3cb8) [64];
  undefined1 (*local_3ca8) [32];
  undefined8 local_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  undefined1 (*local_3c40) [64];
  uint local_3bb0;
  uint uStack_3bac;
  uint uStack_3ba8;
  uint uStack_3ba4;
  uint local_3b94;
  uint local_3b90;
  uint uStack_3b8c;
  uint uStack_3b88;
  uint uStack_3b84;
  uint local_3b74;
  uint local_3b70;
  uint uStack_3b6c;
  uint uStack_3b68;
  uint uStack_3b64;
  uint local_3b54;
  uint local_3b50;
  uint uStack_3b4c;
  uint uStack_3b48;
  uint uStack_3b44;
  uint local_3b34;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 local_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined1 local_3ac0 [64];
  uint local_3a70;
  uint local_3a6c;
  uint local_3a68;
  uint local_3a64;
  undefined1 local_3a60 [16];
  undefined1 auStack_3a50 [16];
  uint local_3a40;
  uint local_3a3c;
  uint local_3a38;
  uint local_3a34;
  uint local_3a30;
  uint local_3a2c;
  uint local_3a28;
  uint local_3a24;
  undefined1 local_3a20 [16];
  undefined1 auStack_3a10 [16];
  uint local_3a00;
  uint local_39fc;
  uint local_39f8;
  uint local_39f4;
  uint local_39f0;
  uint local_39ec;
  uint local_39e8;
  uint local_39e4;
  undefined1 local_39e0 [16];
  undefined1 auStack_39d0 [16];
  uint local_39b0;
  uint local_39ac;
  uint local_39a8;
  uint local_39a4;
  uint local_39a0;
  uint local_399c;
  uint local_3998;
  uint local_3994;
  undefined1 *local_3990;
  undefined8 *local_3988;
  undefined1 *local_3980;
  undefined1 *local_3978;
  undefined8 *local_3970;
  undefined1 *local_3968;
  undefined8 *local_3960;
  undefined8 *local_3958;
  undefined1 *local_3950;
  undefined1 *local_3930;
  undefined1 *local_3928;
  undefined1 *local_3920;
  undefined1 local_3900 [32];
  undefined1 local_38e0 [32];
  float local_38c0;
  float fStack_38bc;
  float fStack_38b8;
  float fStack_38b4;
  float fStack_38b0;
  float fStack_38ac;
  float fStack_38a8;
  float fStack_38a4;
  undefined1 local_38a0 [32];
  undefined1 local_3880 [32];
  undefined1 local_3860 [32];
  undefined1 local_3840 [32];
  undefined1 local_3820 [32];
  undefined1 local_3800 [32];
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined1 local_3700 [8];
  float fStack_36f8;
  float fStack_36f4;
  float fStack_36f0;
  float fStack_36ec;
  float fStack_36e8;
  float fStack_36e4;
  undefined4 local_36d0;
  undefined4 local_36cc;
  undefined4 local_36c8;
  undefined4 local_36c4;
  undefined1 local_36c0 [16];
  undefined1 auStack_36b0 [16];
  undefined4 local_36a0;
  undefined4 local_369c;
  undefined4 local_3698;
  undefined4 local_3694;
  undefined4 local_3690;
  undefined4 local_368c;
  undefined4 local_3688;
  undefined4 local_3684;
  undefined1 local_3680 [16];
  undefined1 auStack_3670 [16];
  undefined4 local_3660;
  undefined4 local_365c;
  undefined4 local_3658;
  undefined4 local_3654;
  undefined4 local_3650;
  undefined4 local_364c;
  undefined4 local_3648;
  undefined4 local_3644;
  undefined1 local_3640 [16];
  undefined1 auStack_3630 [16];
  undefined4 local_3620;
  undefined4 local_361c;
  undefined4 local_3618;
  undefined4 local_3614;
  undefined4 local_3610;
  undefined4 local_360c;
  undefined4 local_3608;
  undefined4 local_3604;
  undefined1 local_3600 [16];
  undefined1 auStack_35f0 [16];
  undefined4 local_35e0;
  undefined4 local_35dc;
  undefined4 local_35d8;
  undefined4 local_35d4;
  undefined4 local_35d0;
  undefined4 local_35cc;
  undefined4 local_35c8;
  undefined4 local_35c4;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined1 local_3500 [32];
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined1 local_34c0 [32];
  undefined1 local_34a0 [32];
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined1 local_3460 [32];
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined1 local_3380 [32];
  undefined1 local_3360 [32];
  undefined1 local_3340 [32];
  undefined1 local_3320 [32];
  undefined1 local_3300 [32];
  undefined1 local_32e0 [32];
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined1 local_3220 [32];
  float local_3020;
  float fStack_301c;
  float fStack_3018;
  float fStack_3014;
  float fStack_3010;
  float fStack_300c;
  float fStack_3008;
  float fStack_3004;
  float local_3000;
  float fStack_2ffc;
  float fStack_2ff8;
  float fStack_2ff4;
  float fStack_2ff0;
  float fStack_2fec;
  float fStack_2fe8;
  float fStack_2fe4;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  float local_2780;
  float fStack_277c;
  float fStack_2778;
  float fStack_2774;
  float fStack_2770;
  float fStack_276c;
  float fStack_2768;
  float fStack_2764;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  float local_23a0;
  float fStack_239c;
  float fStack_2398;
  float fStack_2394;
  float local_2320;
  float fStack_231c;
  float fStack_2318;
  float fStack_2314;
  float fStack_2310;
  float fStack_230c;
  float fStack_2308;
  float fStack_2304;
  undefined1 local_1d40 [32];
  undefined1 local_1d20 [32];
  undefined1 local_1d00 [32];
  undefined1 local_1ce0 [32];
  undefined1 local_1cc0 [32];
  undefined1 local_1ca0 [32];
  undefined1 local_1c80 [32];
  undefined1 local_1c60 [32];
  float local_1c40;
  float fStack_1c3c;
  float fStack_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  float fStack_1c28;
  float fStack_1c24;
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float fStack_1c08;
  float fStack_1c04;
  undefined1 local_1c00 [32];
  undefined1 local_1be0 [32];
  undefined1 local_1bc0 [32];
  undefined1 local_1ba0 [32];
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined1 local_19e0 [32];
  undefined1 local_19c0 [8];
  float fStack_19b8;
  float fStack_19b4;
  float fStack_19b0;
  float fStack_19ac;
  float fStack_19a8;
  float fStack_19a4;
  float local_19a0;
  float fStack_199c;
  float fStack_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  float fStack_1988;
  float fStack_1984;
  undefined4 local_1974;
  undefined4 local_1970;
  undefined4 local_196c;
  undefined4 local_1968;
  undefined4 local_1964;
  undefined4 local_1960;
  undefined4 local_195c;
  undefined4 local_1958;
  undefined4 local_1954;
  undefined4 local_1950;
  undefined4 local_194c;
  undefined4 local_1948;
  undefined4 local_1944;
  undefined1 local_1940 [16];
  undefined1 auStack_1930 [16];
  undefined4 local_1920;
  undefined4 local_191c;
  undefined4 local_1918;
  undefined4 local_1914;
  undefined4 local_1910;
  undefined4 local_190c;
  undefined4 local_1908;
  undefined4 local_1904;
  undefined1 local_1900 [16];
  undefined1 auStack_18f0 [16];
  undefined4 local_18e0;
  undefined4 local_18dc;
  undefined4 local_18d8;
  undefined4 local_18d4;
  undefined4 local_18d0;
  undefined4 local_18cc;
  undefined4 local_18c8;
  undefined4 local_18c4;
  undefined1 local_18c0 [16];
  undefined1 auStack_18b0 [16];
  undefined4 local_18a0;
  undefined4 local_189c;
  undefined4 local_1898;
  undefined4 local_1894;
  undefined4 local_1890;
  undefined4 local_188c;
  undefined4 local_1888;
  undefined4 local_1884;
  undefined1 local_1880 [16];
  undefined1 auStack_1870 [16];
  undefined4 local_1860;
  undefined4 local_185c;
  undefined4 local_1858;
  undefined4 local_1854;
  undefined4 local_1850;
  undefined4 local_184c;
  undefined4 local_1848;
  undefined4 local_1844;
  undefined1 local_1840 [16];
  undefined1 auStack_1830 [16];
  undefined4 local_1820;
  undefined4 local_181c;
  undefined4 local_1818;
  undefined4 local_1814;
  undefined4 local_1810;
  undefined4 local_180c;
  undefined4 local_1808;
  undefined4 local_1804;
  undefined1 local_1800 [16];
  undefined1 auStack_17f0 [16];
  undefined4 local_17e0;
  undefined4 local_17dc;
  undefined4 local_17d8;
  undefined4 local_17d4;
  undefined4 local_17d0;
  undefined4 local_17cc;
  undefined4 local_17c8;
  undefined4 local_17c4;
  undefined1 local_17c0 [16];
  undefined1 auStack_17b0 [16];
  undefined4 local_17a0;
  undefined4 local_179c;
  undefined4 local_1798;
  undefined4 local_1794;
  undefined4 local_1790;
  undefined4 local_178c;
  undefined4 local_1788;
  undefined4 local_1784;
  undefined1 local_1780 [16];
  undefined1 auStack_1770 [16];
  undefined4 local_1760;
  undefined4 local_175c;
  undefined4 local_1758;
  undefined4 local_1754;
  undefined4 local_1750;
  undefined4 local_174c;
  undefined4 local_1748;
  undefined4 local_1744;
  undefined1 local_1740 [16];
  undefined1 auStack_1730 [16];
  undefined4 local_1720;
  undefined4 local_171c;
  undefined4 local_1718;
  undefined4 local_1714;
  undefined4 local_1710;
  undefined4 local_170c;
  undefined4 local_1708;
  undefined4 local_1704;
  undefined1 local_1700 [16];
  undefined1 auStack_16f0 [16];
  undefined4 local_16e0;
  undefined4 local_16dc;
  undefined4 local_16d8;
  undefined4 local_16d4;
  undefined4 local_16d0;
  undefined4 local_16cc;
  undefined4 local_16c8;
  undefined4 local_16c4;
  undefined1 local_16c0 [16];
  undefined1 auStack_16b0 [16];
  undefined4 local_16a0;
  undefined4 local_169c;
  undefined4 local_1698;
  undefined4 local_1694;
  undefined4 local_1690;
  undefined4 local_168c;
  undefined4 local_1688;
  undefined4 local_1684;
  undefined1 local_1680 [16];
  undefined1 auStack_1670 [16];
  undefined4 local_1660;
  undefined4 local_165c;
  undefined4 local_1658;
  undefined4 local_1654;
  undefined4 local_1650;
  undefined4 local_164c;
  undefined4 local_1648;
  undefined4 local_1644;
  undefined1 local_1640 [16];
  undefined1 auStack_1630 [16];
  undefined4 local_1620;
  undefined4 local_161c;
  undefined4 local_1618;
  undefined4 local_1614;
  undefined4 local_1610;
  undefined4 local_160c;
  undefined4 local_1608;
  undefined4 local_1604;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 *local_1500;
  undefined1 *local_14f8;
  float *local_14f0;
  undefined8 *local_14e8;
  undefined1 *local_14e0;
  float *local_14d8;
  undefined8 *local_14d0;
  undefined1 *local_14c8;
  float *local_14c0;
  undefined8 *local_14b8;
  undefined1 *local_14b0;
  float *local_14a8;
  undefined8 *local_14a0;
  undefined8 *local_1498;
  float *local_1490;
  undefined8 *local_1488;
  undefined1 *local_1480;
  float *local_1478;
  undefined8 *local_1470;
  undefined1 *local_1468;
  float *local_1460;
  undefined8 *local_1458;
  undefined8 *local_1450;
  float *local_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  float fStack_1004;
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  undefined1 local_fa0 [32];
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined1 local_d00 [32];
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  float local_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  
  local_3e38 = in_R8D;
  local_3e34 = in_ECX;
  local_3e30 = in_RDX;
  local_3e28 = in_RSI;
  local_3e20 = in_RDI;
  if (in_R8D == 0x10) {
    for (local_3e40 = 0; local_3e40 < local_3e34; local_3e40 = local_3e40 + 1) {
      local_3e08 = local_3e20;
      uVar128 = *(undefined8 *)*local_3e20;
      uVar133 = *(undefined8 *)(*local_3e20 + 8);
      uVar138 = *(undefined8 *)(*local_3e20 + 0x10);
      uVar143 = *(undefined8 *)(*local_3e20 + 0x18);
      uVar144 = *(undefined8 *)local_3e20[1];
      uVar145 = *(undefined8 *)(local_3e20[1] + 8);
      uVar146 = *(undefined8 *)(local_3e20[1] + 0x10);
      uVar147 = *(undefined8 *)(local_3e20[1] + 0x18);
      local_3a70 = *local_3e28;
      local_3ac0 = vbroadcastss_avx512f(ZEXT416(local_3a70));
      local_3ec0 = local_3ac0._0_8_;
      uStack_3eb8 = local_3ac0._8_8_;
      uStack_3eb0 = local_3ac0._16_8_;
      uStack_3ea8 = local_3ac0._24_8_;
      uStack_3ea0 = local_3ac0._32_8_;
      uStack_3e98 = local_3ac0._40_8_;
      uStack_3e90 = local_3ac0._48_8_;
      uStack_3e88 = local_3ac0._56_8_;
      local_3950 = &local_3e39;
      local_3958 = &local_3e80;
      local_3960 = &local_3ec0;
      y[2] = (float)(int)in_stack_ffffffffffffbf80;
      y[3] = (float)(int)((ulong)in_stack_ffffffffffffbf80 >> 0x20);
      y[0] = (float)(int)in_stack_ffffffffffffbf78;
      y[1] = (float)(int)((ulong)in_stack_ffffffffffffbf78 >> 0x20);
      y[4] = (float)(int)in_stack_ffffffffffffbf88;
      y[5] = (float)(int)((ulong)in_stack_ffffffffffffbf88 >> 0x20);
      y[6] = (float)(int)in_stack_ffffffffffffbf90;
      y[7] = (float)(int)((ulong)in_stack_ffffffffffffbf90 >> 0x20);
      y[8] = (float)(int)in_stack_ffffffffffffbf98;
      y[9] = (float)(int)((ulong)in_stack_ffffffffffffbf98 >> 0x20);
      y[10] = (float)(int)in_stack_ffffffffffffbfa0;
      y[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbfa0 >> 0x20);
      y[0xc] = (float)(int)in_stack_ffffffffffffbfa8;
      y[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbfa8 >> 0x20);
      y[0xe] = (float)(int)in_stack_ffffffffffffbfb0;
      y[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbfb0 >> 0x20);
      x[2] = (float)in_stack_ffffffffffffbf40._0_4_;
      x[3] = (float)in_stack_ffffffffffffbf40._4_4_;
      x[4] = (float)in_stack_ffffffffffffbf40._8_4_;
      x[5] = (float)in_stack_ffffffffffffbf40._12_4_;
      x[6] = (float)in_stack_ffffffffffffbf40._16_4_;
      x[7] = (float)in_stack_ffffffffffffbf40._20_4_;
      x[8] = (float)in_stack_ffffffffffffbf40._24_4_;
      x[0] = (float)(int)in_stack_ffffffffffffbf38;
      x[1] = (float)(int)((ulong)in_stack_ffffffffffffbf38 >> 0x20);
      x[9] = (float)in_stack_ffffffffffffbf5c;
      x[10] = (float)(int)in_stack_ffffffffffffbf60;
      x[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbf60 >> 0x20);
      x[0xc] = (float)(int)in_stack_ffffffffffffbf68;
      x[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbf68 >> 0x20);
      x[0xe] = (float)(int)in_stack_ffffffffffffbf70;
      x[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbf70 >> 0x20);
      local_3e80 = uVar128;
      uStack_3e78 = uVar133;
      uStack_3e70 = uVar138;
      uStack_3e68 = uVar143;
      uStack_3e60 = uVar144;
      uStack_3e58 = uVar145;
      uStack_3e50 = uVar146;
      uStack_3e48 = uVar147;
      atan2512_ps(y,x);
      local_3cb8 = local_3e30;
      auVar29._8_8_ = uVar133;
      auVar29._0_8_ = uVar128;
      auVar29._16_8_ = uVar138;
      auVar29._24_8_ = uVar143;
      auVar29._32_8_ = uVar144;
      auVar29._40_8_ = uVar145;
      auVar29._48_8_ = uVar146;
      auVar29._56_8_ = uVar147;
      *local_3e30 = auVar29;
      local_3e20 = local_3e20 + 2;
      local_3e28 = local_3e28 + 1;
      local_3e30 = local_3e30 + 1;
      local_3f00 = uVar128;
      uStack_3ef8 = uVar133;
      uStack_3ef0 = uVar138;
      uStack_3ee8 = uVar143;
      uStack_3ee0 = uVar144;
      uStack_3ed8 = uVar145;
      uStack_3ed0 = uVar146;
      uStack_3ec8 = uVar147;
      local_3d00 = uVar128;
      uStack_3cf8 = uVar133;
      uStack_3cf0 = uVar138;
      uStack_3ce8 = uVar143;
      uStack_3ce0 = uVar144;
      uStack_3cd8 = uVar145;
      uStack_3cd0 = uVar146;
      uStack_3cc8 = uVar147;
    }
  }
  if (local_3e38 == 8) {
    for (local_3f04 = 0; local_3f04 + 1 < local_3e34; local_3f04 = local_3f04 + 2) {
      local_3e10 = local_3e20;
      uVar128 = *(undefined8 *)*local_3e20;
      uVar133 = *(undefined8 *)(*local_3e20 + 8);
      uVar138 = *(undefined8 *)(*local_3e20 + 0x10);
      uVar143 = *(undefined8 *)(*local_3e20 + 0x18);
      uVar144 = *(undefined8 *)local_3e20[1];
      uVar145 = *(undefined8 *)(local_3e20[1] + 8);
      uVar146 = *(undefined8 *)(local_3e20[1] + 0x10);
      uVar147 = *(undefined8 *)(local_3e20[1] + 0x18);
      local_3a64 = *local_3e28;
      auVar3 = vinsertps_avx(ZEXT416(local_3a64),ZEXT416(local_3a64),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a64),0x20);
      local_3a60 = vinsertps_avx(auVar3,ZEXT416(local_3a64),0x30);
      auVar3 = vinsertps_avx(ZEXT416(local_3a64),ZEXT416(local_3a64),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a64),0x20);
      auStack_3a50 = vinsertps_avx(auVar3,ZEXT416(local_3a64),0x30);
      local_3fa0 = local_3a60._0_8_;
      uStack_3f98 = local_3a60._8_8_;
      uStack_3f90 = auStack_3a50._0_8_;
      uStack_3f88 = auStack_3a50._8_8_;
      local_3a68 = local_3e28[1];
      auVar3 = vinsertps_avx(ZEXT416(local_3a68),ZEXT416(local_3a68),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a68),0x20);
      local_3a20 = vinsertps_avx(auVar3,ZEXT416(local_3a68),0x30);
      auVar3 = vinsertps_avx(ZEXT416(local_3a68),ZEXT416(local_3a68),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a68),0x20);
      auStack_3a10 = vinsertps_avx(auVar3,ZEXT416(local_3a68),0x30);
      local_3fc0 = local_3a20._0_8_;
      uStack_3fb8 = local_3a20._8_8_;
      uStack_3fb0 = auStack_3a10._0_8_;
      uStack_3fa8 = auStack_3a10._8_8_;
      local_3ae0 = local_3a60._0_8_;
      uStack_3ad8 = local_3a60._8_8_;
      uStack_3ad0 = auStack_3a50._0_8_;
      uStack_3ac8 = auStack_3a50._8_8_;
      auVar124._16_8_ = auStack_3a10._0_8_;
      auVar124._0_16_ = local_3a20;
      auVar124._24_8_ = auStack_3a10._8_8_;
      local_4000 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT824(auStack_3a50._8_8_,
                                                 CONCAT816(auStack_3a50._0_8_,local_3a60))),auVar124
                              ,1);
      local_3968 = &local_3e39;
      local_3970 = &local_3f80;
      local_3978 = local_4000;
      y_00[2] = (float)(int)in_stack_ffffffffffffbf80;
      y_00[3] = (float)(int)((ulong)in_stack_ffffffffffffbf80 >> 0x20);
      y_00[0] = (float)(int)in_stack_ffffffffffffbf78;
      y_00[1] = (float)(int)((ulong)in_stack_ffffffffffffbf78 >> 0x20);
      y_00[4] = (float)(int)in_stack_ffffffffffffbf88;
      y_00[5] = (float)(int)((ulong)in_stack_ffffffffffffbf88 >> 0x20);
      y_00[6] = (float)(int)in_stack_ffffffffffffbf90;
      y_00[7] = (float)(int)((ulong)in_stack_ffffffffffffbf90 >> 0x20);
      y_00[8] = (float)(int)in_stack_ffffffffffffbf98;
      y_00[9] = (float)(int)((ulong)in_stack_ffffffffffffbf98 >> 0x20);
      y_00[10] = (float)(int)in_stack_ffffffffffffbfa0;
      y_00[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbfa0 >> 0x20);
      y_00[0xc] = (float)(int)in_stack_ffffffffffffbfa8;
      y_00[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbfa8 >> 0x20);
      y_00[0xe] = (float)(int)in_stack_ffffffffffffbfb0;
      y_00[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbfb0 >> 0x20);
      x_00[2] = (float)in_stack_ffffffffffffbf40._0_4_;
      x_00[3] = (float)in_stack_ffffffffffffbf40._4_4_;
      x_00[4] = (float)in_stack_ffffffffffffbf40._8_4_;
      x_00[5] = (float)in_stack_ffffffffffffbf40._12_4_;
      x_00[6] = (float)in_stack_ffffffffffffbf40._16_4_;
      x_00[7] = (float)in_stack_ffffffffffffbf40._20_4_;
      x_00[8] = (float)in_stack_ffffffffffffbf40._24_4_;
      x_00[0] = (float)(int)in_stack_ffffffffffffbf38;
      x_00[1] = (float)(int)((ulong)in_stack_ffffffffffffbf38 >> 0x20);
      x_00[9] = (float)in_stack_ffffffffffffbf5c;
      x_00[10] = (float)(int)in_stack_ffffffffffffbf60;
      x_00[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbf60 >> 0x20);
      x_00[0xc] = (float)(int)in_stack_ffffffffffffbf68;
      x_00[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbf68 >> 0x20);
      x_00[0xe] = (float)(int)in_stack_ffffffffffffbf70;
      x_00[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbf70 >> 0x20);
      local_3f80 = uVar128;
      uStack_3f78 = uVar133;
      uStack_3f70 = uVar138;
      uStack_3f68 = uVar143;
      uStack_3f60 = uVar144;
      uStack_3f58 = uVar145;
      uStack_3f50 = uVar146;
      uStack_3f48 = uVar147;
      local_3a40 = local_3a64;
      local_3a3c = local_3a64;
      local_3a38 = local_3a64;
      local_3a34 = local_3a64;
      local_3a30 = local_3a64;
      local_3a2c = local_3a64;
      local_3a28 = local_3a64;
      local_3a24 = local_3a64;
      local_3a00 = local_3a68;
      local_39fc = local_3a68;
      local_39f8 = local_3a68;
      local_39f4 = local_3a68;
      local_39f0 = local_3a68;
      local_39ec = local_3a68;
      local_39e8 = local_3a68;
      local_39e4 = local_3a68;
      atan2512_ps(y_00,x_00);
      local_3d08 = local_3e30;
      auVar28._8_8_ = uVar133;
      auVar28._0_8_ = uVar128;
      auVar28._16_8_ = uVar138;
      auVar28._24_8_ = uVar143;
      auVar28._32_8_ = uVar144;
      auVar28._40_8_ = uVar145;
      auVar28._48_8_ = uVar146;
      auVar28._56_8_ = uVar147;
      *local_3e30 = auVar28;
      local_3e20 = local_3e20 + 2;
      local_3e28 = local_3e28 + 2;
      local_3e30 = local_3e30 + 1;
      local_3d80 = uVar128;
      uStack_3d78 = uVar133;
      uStack_3d70 = uVar138;
      uStack_3d68 = uVar143;
      uStack_3d60 = uVar144;
      uStack_3d58 = uVar145;
      uStack_3d50 = uVar146;
      uStack_3d48 = uVar147;
    }
    for (; local_3f04 < local_3e34; local_3f04 = local_3f04 + 1) {
      local_3ca8 = local_3e20;
      in_stack_ffffffffffffbfa0 = *(undefined8 *)*local_3e20;
      in_stack_ffffffffffffbfa8 = *(undefined8 *)(*local_3e20 + 8);
      in_stack_ffffffffffffbfb0 = *(undefined8 *)(*local_3e20 + 0x10);
      uStack_3728 = *(undefined8 *)(*local_3e20 + 0x18);
      local_3a6c = *local_3e28;
      auVar3 = vinsertps_avx(ZEXT416(local_3a6c),ZEXT416(local_3a6c),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a6c),0x20);
      local_39e0 = vinsertps_avx(auVar3,ZEXT416(local_3a6c),0x30);
      auVar3 = vinsertps_avx(ZEXT416(local_3a6c),ZEXT416(local_3a6c),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3a6c),0x20);
      auStack_39d0 = vinsertps_avx(auVar3,ZEXT416(local_3a6c),0x30);
      local_3760 = local_39e0._0_8_;
      uStack_3758 = local_39e0._8_8_;
      uStack_3750 = auStack_39d0._0_8_;
      uStack_3748 = auStack_39d0._8_8_;
      local_3920 = &local_3e39;
      local_3928 = &stack0xffffffffffffbfa0;
      local_3930 = &stack0xffffffffffffbf80;
      auVar71._16_8_ = auStack_39d0._0_8_;
      auVar71._0_16_ = local_39e0;
      auVar71._24_8_ = auStack_39d0._8_8_;
      auVar70._16_8_ = auStack_39d0._0_8_;
      auVar70._0_16_ = local_39e0;
      auVar70._24_8_ = auStack_39d0._8_8_;
      auVar69._16_8_ = auStack_39d0._0_8_;
      auVar69._0_16_ = local_39e0;
      auVar69._24_8_ = auStack_39d0._8_8_;
      auVar68._16_8_ = auStack_39d0._0_8_;
      auVar68._0_16_ = local_39e0;
      auVar68._24_8_ = auStack_39d0._8_8_;
      local_36c4 = 0;
      local_36a0 = 0;
      auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
      local_36c0 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
      auStack_36b0 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
      local_3780 = local_36c0._0_8_;
      uStack_3778 = local_36c0._8_8_;
      uStack_3770 = auStack_36b0._0_8_;
      uStack_3768 = auStack_36b0._8_8_;
      local_36c8 = 0x80000000;
      local_3660 = 0x80000000;
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      local_3680 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      auStack_3670 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      local_37a0 = local_3680._0_8_;
      uStack_3798 = local_3680._8_8_;
      uStack_3790 = auStack_3670._0_8_;
      uStack_3788 = auStack_3670._8_8_;
      local_36cc = 0x40490fdb;
      local_3620 = 0x40490fdb;
      auVar3 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40490fdb),0x20);
      local_3640 = vinsertps_avx(auVar3,ZEXT416(0x40490fdb),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40490fdb),0x20);
      auStack_3630 = vinsertps_avx(auVar3,ZEXT416(0x40490fdb),0x30);
      local_37c0 = local_3640._0_8_;
      uStack_37b8 = local_3640._8_8_;
      uStack_37b0 = auStack_3630._0_8_;
      uStack_37a8 = auStack_3630._8_8_;
      local_36d0 = 0x3fc90fdb;
      local_35e0 = 0x3fc90fdb;
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      local_3600 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      auStack_35f0 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      local_37e0 = local_3600._0_8_;
      uStack_37d8 = local_3600._8_8_;
      uStack_37d0 = auStack_35f0._0_8_;
      uStack_37c8 = auStack_35f0._8_8_;
      auVar2._16_8_ = auStack_36b0._0_8_;
      auVar2._0_16_ = local_36c0;
      auVar2._24_8_ = auStack_36b0._8_8_;
      local_3800 = vcmpps_avx(auVar68,auVar2,4);
      auVar125._16_8_ = auStack_36b0._0_8_;
      auVar125._0_16_ = local_36c0;
      auVar125._24_8_ = auStack_36b0._8_8_;
      local_3820 = vcmpps_avx(*local_3e20,auVar125,4);
      local_33a0 = local_3800._0_8_;
      uStack_3398 = local_3800._8_8_;
      uStack_3390 = local_3800._16_8_;
      uStack_3388 = local_3800._24_8_;
      local_33c0 = local_3820._0_8_;
      uStack_33b8 = local_3820._8_8_;
      uStack_33b0 = local_3820._16_8_;
      uStack_33a8 = local_3820._24_8_;
      local_3840 = vpand_avx2(local_3800,local_3820);
      local_33e0 = local_3680._0_8_;
      uStack_33d8 = local_3680._8_8_;
      uStack_33d0 = auStack_3670._0_8_;
      uStack_33c8 = auStack_3670._8_8_;
      auVar19._16_8_ = auStack_3670._0_8_;
      auVar19._0_16_ = local_3680;
      auVar19._24_8_ = auStack_3670._8_8_;
      local_3860 = vpand_avx2(auVar19,auVar69);
      local_3420 = local_3680._0_8_;
      uStack_3418 = local_3680._8_8_;
      uStack_3410 = auStack_3670._0_8_;
      uStack_3408 = auStack_3670._8_8_;
      auVar18._16_8_ = auStack_3670._0_8_;
      auVar18._0_16_ = local_3680;
      auVar18._24_8_ = auStack_3670._8_8_;
      local_3880 = vpand_avx2(auVar18,*local_3e20);
      auVar13._16_8_ = auStack_36b0._0_8_;
      auVar13._0_16_ = local_36c0;
      auVar13._24_8_ = auStack_36b0._8_8_;
      local_34a0 = vcmpps_avx(auVar70,auVar13,1);
      local_3460 = vcmpps_avx(*local_3e20,auVar13,1);
      local_3480 = local_3680._0_8_;
      uStack_3478 = local_3680._8_8_;
      uStack_3470 = auStack_3670._0_8_;
      uStack_3468 = auStack_3670._8_8_;
      auVar17._16_8_ = auStack_3670._0_8_;
      auVar17._0_16_ = local_3680;
      auVar17._24_8_ = auStack_3670._8_8_;
      local_3220 = vpand_avx2(local_3460,auVar17);
      local_3240 = local_3640._0_8_;
      uStack_3238 = local_3640._8_8_;
      uStack_3230 = auStack_3630._0_8_;
      uStack_3228 = auStack_3630._8_8_;
      auVar32._16_8_ = auStack_3630._0_8_;
      auVar32._0_16_ = local_3640;
      auVar32._24_8_ = auStack_3630._8_8_;
      local_34c0 = vpor_avx2(local_3220,auVar32);
      local_38a0 = vpand_avx2(local_34a0,local_34c0);
      local_19e0 = vdivps_avx(*local_3e20,auVar71);
      local_1944 = 0x80000000;
      local_1920 = 0x80000000;
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      local_1940 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      auStack_1930 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      local_1a00 = local_1940._0_8_;
      uStack_19f8 = local_1940._8_8_;
      uStack_19f0 = auStack_1930._0_8_;
      uStack_19e8 = auStack_1930._8_8_;
      local_1948 = 0x3f800000;
      local_18e0 = 0x3f800000;
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      local_1900 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      auStack_18f0 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      local_1a20 = local_1900._0_8_;
      uStack_1a18 = local_1900._8_8_;
      uStack_1a10 = auStack_18f0._0_8_;
      uStack_1a08 = auStack_18f0._8_8_;
      local_194c = 0xbf800000;
      local_18a0 = 0xbf800000;
      auVar3 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x20);
      local_18c0 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x20);
      auStack_18b0 = vinsertps_avx(auVar3,ZEXT416(0xbf800000),0x30);
      local_1a40 = local_18c0._0_8_;
      uStack_1a38 = local_18c0._8_8_;
      uStack_1a30 = auStack_18b0._0_8_;
      uStack_1a28 = auStack_18b0._8_8_;
      local_1950 = 0x3fc90fdb;
      local_1860 = 0x3fc90fdb;
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      local_1880 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      auStack_1870 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      local_1a60 = local_1880._0_8_;
      uStack_1a58 = local_1880._8_8_;
      uStack_1a50 = auStack_1870._0_8_;
      uStack_1a48 = auStack_1870._8_8_;
      local_1954 = 0x3f800000;
      local_1820 = 0x3f800000;
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      local_1840 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      auStack_1830 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      local_1a80 = local_1840._0_8_;
      uStack_1a78 = local_1840._8_8_;
      uStack_1a70 = auStack_1830._0_8_;
      uStack_1a68 = auStack_1830._8_8_;
      local_1958 = 0xbeaaaa53;
      local_17e0 = 0xbeaaaa53;
      auVar3 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x20);
      local_1800 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x20);
      auStack_17f0 = vinsertps_avx(auVar3,ZEXT416(0xbeaaaa53),0x30);
      local_1aa0 = local_1800._0_8_;
      uStack_1a98 = local_1800._8_8_;
      uStack_1a90 = auStack_17f0._0_8_;
      uStack_1a88 = auStack_17f0._8_8_;
      local_195c = 0x3e4cb974;
      local_17a0 = 0x3e4cb974;
      auVar3 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x20);
      local_17c0 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x20);
      auStack_17b0 = vinsertps_avx(auVar3,ZEXT416(0x3e4cb974),0x30);
      local_1ac0 = local_17c0._0_8_;
      uStack_1ab8 = local_17c0._8_8_;
      uStack_1ab0 = auStack_17b0._0_8_;
      uStack_1aa8 = auStack_17b0._8_8_;
      local_1960 = 0xbe117200;
      local_1760 = 0xbe117200;
      auVar3 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x20);
      local_1780 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x20);
      auStack_1770 = vinsertps_avx(auVar3,ZEXT416(0xbe117200),0x30);
      local_1ae0 = local_1780._0_8_;
      uStack_1ad8 = local_1780._8_8_;
      uStack_1ad0 = auStack_1770._0_8_;
      uStack_1ac8 = auStack_1770._8_8_;
      local_1964 = 0x3dd9ed24;
      local_1720 = 0x3dd9ed24;
      auVar3 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x20);
      local_1740 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x20);
      auStack_1730 = vinsertps_avx(auVar3,ZEXT416(0x3dd9ed24),0x30);
      local_1b00 = local_1740._0_8_;
      uStack_1af8 = local_1740._8_8_;
      uStack_1af0 = auStack_1730._0_8_;
      uStack_1ae8 = auStack_1730._8_8_;
      local_1968 = 0xbd99b01e;
      local_16e0 = 0xbd99b01e;
      auVar3 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x20);
      local_1700 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x20);
      auStack_16f0 = vinsertps_avx(auVar3,ZEXT416(0xbd99b01e),0x30);
      local_1b20 = local_1700._0_8_;
      uStack_1b18 = local_1700._8_8_;
      uStack_1b10 = auStack_16f0._0_8_;
      uStack_1b08 = auStack_16f0._8_8_;
      local_196c = 0x3d2edd4e;
      local_16a0 = 0x3d2edd4e;
      auVar3 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x20);
      local_16c0 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x20);
      auStack_16b0 = vinsertps_avx(auVar3,ZEXT416(0x3d2edd4e),0x30);
      local_1b40 = local_16c0._0_8_;
      uStack_1b38 = local_16c0._8_8_;
      uStack_1b30 = auStack_16b0._0_8_;
      uStack_1b28 = auStack_16b0._8_8_;
      local_1970 = 0xbc83a25c;
      local_1660 = 0xbc83a25c;
      auVar3 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x20);
      local_1680 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x20);
      auStack_1670 = vinsertps_avx(auVar3,ZEXT416(0xbc83a25c),0x30);
      local_1b60 = local_1680._0_8_;
      uStack_1b58 = local_1680._8_8_;
      uStack_1b50 = auStack_1670._0_8_;
      uStack_1b48 = auStack_1670._8_8_;
      local_1974 = 0x3b3ac537;
      local_1620 = 0x3b3ac537;
      auVar3 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x20);
      local_1640 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x20);
      auStack_1630 = vinsertps_avx(auVar3,ZEXT416(0x3b3ac537),0x30);
      local_1b80 = local_1640._0_8_;
      uStack_1b78 = local_1640._8_8_;
      uStack_1b70 = auStack_1630._0_8_;
      uStack_1b68 = auStack_1630._8_8_;
      local_1360 = local_1940._0_8_;
      uStack_1358 = local_1940._8_8_;
      uStack_1350 = auStack_1930._0_8_;
      uStack_1348 = auStack_1930._8_8_;
      local_1380 = local_19e0._0_8_;
      uStack_1378 = local_19e0._8_8_;
      uStack_1370 = local_19e0._16_8_;
      uStack_1368 = local_19e0._24_8_;
      auVar53._16_8_ = auStack_1930._0_8_;
      auVar53._0_16_ = local_1940;
      auVar53._24_8_ = auStack_1930._8_8_;
      local_1ba0 = vpand_avx2(auVar53,local_19e0);
      local_ee0 = local_1940._0_8_;
      uStack_ed8 = local_1940._8_8_;
      uStack_ed0 = auStack_1930._0_8_;
      uStack_ec8 = auStack_1930._8_8_;
      local_f00 = local_19e0._0_8_;
      uStack_ef8 = local_19e0._8_8_;
      uStack_ef0 = local_19e0._16_8_;
      uStack_ee8 = local_19e0._24_8_;
      auVar56._16_8_ = auStack_1930._0_8_;
      auVar56._0_16_ = local_1940;
      auVar56._24_8_ = auStack_1930._8_8_;
      local_1bc0 = vpandn_avx2(auVar56,local_19e0);
      auVar50._16_8_ = auStack_18f0._0_8_;
      auVar50._0_16_ = local_1900;
      auVar50._24_8_ = auStack_18f0._8_8_;
      local_1be0 = vcmpps_avx(auVar50,local_1bc0,1);
      local_13a0 = local_1be0._0_8_;
      uStack_1398 = local_1be0._8_8_;
      uStack_1390 = local_1be0._16_8_;
      uStack_1388 = local_1be0._24_8_;
      local_13c0 = local_18c0._0_8_;
      uStack_13b8 = local_18c0._8_8_;
      uStack_13b0 = auStack_18b0._0_8_;
      uStack_13a8 = auStack_18b0._8_8_;
      auVar52._16_8_ = auStack_18b0._0_8_;
      auVar52._0_16_ = local_18c0;
      auVar52._24_8_ = auStack_18b0._8_8_;
      local_fa0 = vpand_avx2(local_1be0,auVar52);
      local_f20 = local_1be0._0_8_;
      uStack_f18 = local_1be0._8_8_;
      uStack_f10 = local_1be0._16_8_;
      uStack_f08 = local_1be0._24_8_;
      local_f40 = local_1bc0._0_8_;
      uStack_f38 = local_1bc0._8_8_;
      uStack_f30 = local_1bc0._16_8_;
      uStack_f28 = local_1bc0._24_8_;
      local_fc0 = vpandn_avx2(local_1be0,local_1bc0);
      local_1520 = vpor_avx2(local_fa0,local_fc0);
      local_13e0 = local_1be0._0_8_;
      uStack_13d8 = local_1be0._8_8_;
      uStack_13d0 = local_1be0._16_8_;
      uStack_13c8 = local_1be0._24_8_;
      local_1400 = local_1bc0._0_8_;
      uStack_13f8 = local_1bc0._8_8_;
      uStack_13f0 = local_1bc0._16_8_;
      uStack_13e8 = local_1bc0._24_8_;
      local_fe0 = vpand_avx2(local_1be0,local_1bc0);
      local_f60 = local_1be0._0_8_;
      uStack_f58 = local_1be0._8_8_;
      uStack_f50 = local_1be0._16_8_;
      uStack_f48 = local_1be0._24_8_;
      local_f80 = local_1900._0_8_;
      uStack_f78 = local_1900._8_8_;
      uStack_f70 = auStack_18f0._0_8_;
      uStack_f68 = auStack_18f0._8_8_;
      auVar55._16_8_ = auStack_18f0._0_8_;
      auVar55._0_16_ = local_1900;
      auVar55._24_8_ = auStack_18f0._8_8_;
      local_1000 = vpandn_avx2(local_1be0,auVar55);
      local_1540 = vpor_avx2(local_fe0,local_1000);
      local_1c00 = vdivps_avx(local_1520,local_1540);
      local_1580 = local_1c00._0_8_;
      uStack_1578 = local_1c00._8_8_;
      uStack_1570 = local_1c00._16_8_;
      uStack_1568 = local_1c00._24_8_;
      local_1560._0_4_ = local_1c00._0_4_;
      local_1560._4_4_ = local_1c00._4_4_;
      uStack_1558._0_4_ = local_1c00._8_4_;
      uStack_1558._4_4_ = local_1c00._12_4_;
      uStack_1550._0_4_ = local_1c00._16_4_;
      uStack_1550._4_4_ = local_1c00._20_4_;
      uStack_1548._0_4_ = local_1c00._24_4_;
      uStack_1548._4_4_ = local_1c00._28_4_;
      fStack_1c04 = uStack_1548._4_4_;
      local_1c20 = (float)local_1560 * (float)local_1560;
      fStack_1c1c = local_1560._4_4_ * local_1560._4_4_;
      fStack_1c18 = (float)uStack_1558 * (float)uStack_1558;
      fStack_1c14 = uStack_1558._4_4_ * uStack_1558._4_4_;
      fStack_1c10 = (float)uStack_1550 * (float)uStack_1550;
      fStack_1c0c = uStack_1550._4_4_ * uStack_1550._4_4_;
      fStack_1c08 = (float)uStack_1548 * (float)uStack_1548;
      local_15c0 = CONCAT44(fStack_1c1c,local_1c20);
      uStack_15b8 = CONCAT44(fStack_1c14,fStack_1c18);
      uStack_15b0 = CONCAT44(fStack_1c0c,fStack_1c10);
      uStack_15a8 = CONCAT44(uStack_1548._4_4_,fStack_1c08);
      fStack_1c24 = uStack_1548._4_4_;
      local_1c40 = local_1c20 * local_1c20;
      fStack_1c3c = fStack_1c1c * fStack_1c1c;
      fStack_1c38 = fStack_1c18 * fStack_1c18;
      fStack_1c34 = fStack_1c14 * fStack_1c14;
      fStack_1c30 = fStack_1c10 * fStack_1c10;
      fStack_1c2c = fStack_1c0c * fStack_1c0c;
      fStack_1c28 = fStack_1c08 * fStack_1c08;
      local_14d8 = &local_1c40;
      local_1450 = &local_1b60;
      local_1458 = &local_1b20;
      local_1300 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_12f8 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_12f0 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_12e8 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar89._4_4_ = fStack_1c3c;
      auVar89._0_4_ = local_1c40;
      auVar89._8_4_ = fStack_1c38;
      auVar89._12_4_ = fStack_1c34;
      auVar89._16_4_ = fStack_1c30;
      auVar89._20_4_ = fStack_1c2c;
      auVar89._24_4_ = fStack_1c28;
      auVar89._28_4_ = uStack_1548._4_4_;
      local_1320 = local_1680._0_8_;
      uStack_1318 = local_1680._8_8_;
      uStack_1310 = auStack_1670._0_8_;
      uStack_1308 = auStack_1670._8_8_;
      auVar98._16_8_ = auStack_1670._0_8_;
      auVar98._0_16_ = local_1680;
      auVar98._24_8_ = auStack_1670._8_8_;
      local_1340 = local_1700._0_8_;
      uStack_1338 = local_1700._8_8_;
      uStack_1330 = auStack_16f0._0_8_;
      uStack_1328 = auStack_16f0._8_8_;
      auVar100._16_8_ = auStack_16f0._0_8_;
      auVar100._0_16_ = local_1700;
      auVar100._24_8_ = auStack_16f0._8_8_;
      auVar3 = vfmadd213ps_fma(auVar98,auVar89,auVar100);
      local_1468 = local_1cc0;
      local_1470 = &local_1ae0;
      local_12a0 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_1298 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_1290 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_1288 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar90._4_4_ = fStack_1c3c;
      auVar90._0_4_ = local_1c40;
      auVar90._8_4_ = fStack_1c38;
      auVar90._12_4_ = fStack_1c34;
      auVar90._16_4_ = fStack_1c30;
      auVar90._20_4_ = fStack_1c2c;
      auVar90._24_4_ = fStack_1c28;
      auVar90._28_4_ = uStack_1548._4_4_;
      local_1cc0._0_8_ = auVar3._0_8_;
      local_12c0 = local_1cc0._0_8_;
      local_1cc0._8_8_ = auVar3._8_8_;
      uStack_12b8 = local_1cc0._8_8_;
      uStack_12b0 = 0;
      uStack_12a8 = 0;
      local_12e0 = local_1780._0_8_;
      uStack_12d8 = local_1780._8_8_;
      uStack_12d0 = auStack_1770._0_8_;
      uStack_12c8 = auStack_1770._8_8_;
      auVar102._16_8_ = auStack_1770._0_8_;
      auVar102._0_16_ = local_1780;
      auVar102._24_8_ = auStack_1770._8_8_;
      auVar20 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar90,auVar102);
      local_1480 = local_1ca0;
      local_1488 = &local_1aa0;
      local_1240 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_1238 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_1230 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_1228 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar91._4_4_ = fStack_1c3c;
      auVar91._0_4_ = local_1c40;
      auVar91._8_4_ = fStack_1c38;
      auVar91._12_4_ = fStack_1c34;
      auVar91._16_4_ = fStack_1c30;
      auVar91._20_4_ = fStack_1c2c;
      auVar91._24_4_ = fStack_1c28;
      auVar91._28_4_ = uStack_1548._4_4_;
      local_1ca0._0_8_ = auVar20._0_8_;
      local_1260 = local_1ca0._0_8_;
      local_1ca0._8_8_ = auVar20._8_8_;
      uStack_1258 = local_1ca0._8_8_;
      uStack_1250 = 0;
      uStack_1248 = 0;
      local_1280 = local_1800._0_8_;
      uStack_1278 = local_1800._8_8_;
      uStack_1270 = auStack_17f0._0_8_;
      uStack_1268 = auStack_17f0._8_8_;
      auVar104._16_8_ = auStack_17f0._0_8_;
      auVar104._0_16_ = local_1800;
      auVar104._24_8_ = auStack_17f0._8_8_;
      auVar123 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar91,auVar104);
      local_1498 = &local_1b80;
      local_14a0 = &local_1b40;
      local_11e0 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_11d8 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_11d0 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_11c8 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar92._4_4_ = fStack_1c3c;
      auVar92._0_4_ = local_1c40;
      auVar92._8_4_ = fStack_1c38;
      auVar92._12_4_ = fStack_1c34;
      auVar92._16_4_ = fStack_1c30;
      auVar92._20_4_ = fStack_1c2c;
      auVar92._24_4_ = fStack_1c28;
      auVar92._28_4_ = uStack_1548._4_4_;
      local_1200 = local_1640._0_8_;
      uStack_11f8 = local_1640._8_8_;
      uStack_11f0 = auStack_1630._0_8_;
      uStack_11e8 = auStack_1630._8_8_;
      auVar97._16_8_ = auStack_1630._0_8_;
      auVar97._0_16_ = local_1640;
      auVar97._24_8_ = auStack_1630._8_8_;
      local_1220 = local_16c0._0_8_;
      uStack_1218 = local_16c0._8_8_;
      uStack_1210 = auStack_16b0._0_8_;
      uStack_1208 = auStack_16b0._8_8_;
      auVar99._16_8_ = auStack_16b0._0_8_;
      auVar99._0_16_ = local_16c0;
      auVar99._24_8_ = auStack_16b0._8_8_;
      auVar21 = vfmadd213ps_fma(auVar97,auVar92,auVar99);
      local_14b0 = local_1d40;
      local_14b8 = &local_1b00;
      local_1180 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_1178 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_1170 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_1168 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar93._4_4_ = fStack_1c3c;
      auVar93._0_4_ = local_1c40;
      auVar93._8_4_ = fStack_1c38;
      auVar93._12_4_ = fStack_1c34;
      auVar93._16_4_ = fStack_1c30;
      auVar93._20_4_ = fStack_1c2c;
      auVar93._24_4_ = fStack_1c28;
      auVar93._28_4_ = uStack_1548._4_4_;
      local_1d40._0_8_ = auVar21._0_8_;
      local_11a0 = local_1d40._0_8_;
      local_1d40._8_8_ = auVar21._8_8_;
      uStack_1198 = local_1d40._8_8_;
      uStack_1190 = 0;
      uStack_1188 = 0;
      local_11c0 = local_1740._0_8_;
      uStack_11b8 = local_1740._8_8_;
      uStack_11b0 = auStack_1730._0_8_;
      uStack_11a8 = auStack_1730._8_8_;
      auVar101._16_8_ = auStack_1730._0_8_;
      auVar101._0_16_ = local_1740;
      auVar101._24_8_ = auStack_1730._8_8_;
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar93,auVar101);
      local_14c8 = local_1d20;
      local_14d0 = &local_1ac0;
      local_1120 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_1118 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_1110 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_1108 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar94._4_4_ = fStack_1c3c;
      auVar94._0_4_ = local_1c40;
      auVar94._8_4_ = fStack_1c38;
      auVar94._12_4_ = fStack_1c34;
      auVar94._16_4_ = fStack_1c30;
      auVar94._20_4_ = fStack_1c2c;
      auVar94._24_4_ = fStack_1c28;
      auVar94._28_4_ = uStack_1548._4_4_;
      local_1d20._0_8_ = auVar22._0_8_;
      local_1140 = local_1d20._0_8_;
      local_1d20._8_8_ = auVar22._8_8_;
      uStack_1138 = local_1d20._8_8_;
      uStack_1130 = 0;
      uStack_1128 = 0;
      local_1160 = local_17c0._0_8_;
      uStack_1158 = local_17c0._8_8_;
      uStack_1150 = auStack_17b0._0_8_;
      uStack_1148 = auStack_17b0._8_8_;
      auVar103._16_8_ = auStack_17b0._0_8_;
      auVar103._0_16_ = local_17c0;
      auVar103._24_8_ = auStack_17b0._8_8_;
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar94,auVar103);
      local_14e0 = local_1d00;
      local_14e8 = &local_1a80;
      local_10c0 = CONCAT44(fStack_1c3c,local_1c40);
      uStack_10b8 = CONCAT44(fStack_1c34,fStack_1c38);
      uStack_10b0 = CONCAT44(fStack_1c2c,fStack_1c30);
      uStack_10a8 = CONCAT44(uStack_1548._4_4_,fStack_1c28);
      auVar95._4_4_ = fStack_1c3c;
      auVar95._0_4_ = local_1c40;
      auVar95._8_4_ = fStack_1c38;
      auVar95._12_4_ = fStack_1c34;
      auVar95._16_4_ = fStack_1c30;
      auVar95._20_4_ = fStack_1c2c;
      auVar95._24_4_ = fStack_1c28;
      auVar95._28_4_ = uStack_1548._4_4_;
      local_1d00._0_8_ = auVar23._0_8_;
      local_10e0 = local_1d00._0_8_;
      local_1d00._8_8_ = auVar23._8_8_;
      uStack_10d8 = local_1d00._8_8_;
      uStack_10d0 = 0;
      uStack_10c8 = 0;
      local_1100 = local_1840._0_8_;
      uStack_10f8 = local_1840._8_8_;
      uStack_10f0 = auStack_1830._0_8_;
      uStack_10e8 = auStack_1830._8_8_;
      auVar105._16_8_ = auStack_1830._0_8_;
      auVar105._0_16_ = local_1840;
      auVar105._24_8_ = auStack_1830._8_8_;
      auVar24 = vfmadd213ps_fma(ZEXT1632(auVar23),auVar95,auVar105);
      local_14f0 = &local_1c20;
      local_14f8 = local_1c80;
      local_1500 = local_1ce0;
      local_1060 = CONCAT44(fStack_1c1c,local_1c20);
      uStack_1058 = CONCAT44(fStack_1c14,fStack_1c18);
      uStack_1050 = CONCAT44(fStack_1c0c,fStack_1c10);
      uStack_1048 = CONCAT44(uStack_1548._4_4_,fStack_1c08);
      auVar96._4_4_ = fStack_1c1c;
      auVar96._0_4_ = local_1c20;
      auVar96._8_4_ = fStack_1c18;
      auVar96._12_4_ = fStack_1c14;
      auVar96._16_4_ = fStack_1c10;
      auVar96._20_4_ = fStack_1c0c;
      auVar96._24_4_ = fStack_1c08;
      auVar96._28_4_ = uStack_1548._4_4_;
      local_1c80._0_8_ = auVar123._0_8_;
      local_1080 = local_1c80._0_8_;
      local_1c80._8_8_ = auVar123._8_8_;
      uStack_1078 = local_1c80._8_8_;
      uStack_1070 = 0;
      uStack_1068 = 0;
      local_1ce0._0_8_ = auVar24._0_8_;
      local_10a0 = local_1ce0._0_8_;
      local_1ce0._8_8_ = auVar24._8_8_;
      uStack_1098 = local_1ce0._8_8_;
      uStack_1090 = 0;
      uStack_1088 = 0;
      auVar25 = vfmadd213ps_fma(ZEXT1632(auVar123),auVar96,ZEXT1632(auVar24));
      local_1c60._0_8_ = auVar25._0_8_;
      local_1c60._8_8_ = auVar25._8_8_;
      uStack_15d0 = 0;
      uStack_15c8 = 0;
      local_1600 = local_1c00._0_8_;
      uStack_15f8 = local_1c00._8_8_;
      uStack_15f0 = local_1c00._16_8_;
      uStack_15e8 = local_1c00._24_8_;
      local_15e0._0_4_ = auVar25._0_4_;
      local_15e0._4_4_ = auVar25._4_4_;
      uStack_15d8._0_4_ = auVar25._8_4_;
      uStack_15d8._4_4_ = auVar25._12_4_;
      fStack_1984 = uStack_1548._4_4_;
      local_19a0 = (float)local_15e0 * (float)local_1560;
      fStack_199c = local_15e0._4_4_ * local_1560._4_4_;
      fStack_1998 = (float)uStack_15d8 * (float)uStack_1558;
      fStack_1994 = uStack_15d8._4_4_ * uStack_1558._4_4_;
      fStack_1990 = (float)uStack_1550 * 0.0;
      fStack_198c = uStack_1550._4_4_ * 0.0;
      fStack_1988 = (float)uStack_1548 * 0.0;
      local_1420 = local_1be0._0_8_;
      uStack_1418 = local_1be0._8_8_;
      uStack_1410 = local_1be0._16_8_;
      uStack_1408 = local_1be0._24_8_;
      local_1440 = local_1880._0_8_;
      uStack_1438 = local_1880._8_8_;
      uStack_1430 = auStack_1870._0_8_;
      uStack_1428 = auStack_1870._8_8_;
      auVar51._16_8_ = auStack_1870._0_8_;
      auVar51._0_16_ = local_1880;
      auVar51._24_8_ = auStack_1870._8_8_;
      _local_19c0 = vpand_avx2(local_1be0,auVar51);
      local_1020 = local_19a0 + (float)local_19c0._0_4_;
      fStack_101c = fStack_199c + (float)local_19c0._4_4_;
      fStack_1018 = fStack_1998 + fStack_19b8;
      fStack_1014 = fStack_1994 + fStack_19b4;
      fStack_1010 = fStack_1990 + fStack_19b0;
      fStack_100c = fStack_198c + fStack_19ac;
      fStack_1008 = fStack_1988 + fStack_19a8;
      fStack_1004 = uStack_1548._4_4_ + fStack_19a4;
      local_1040 = local_1ba0._0_8_;
      uStack_1038 = local_1ba0._8_8_;
      uStack_1030 = local_1ba0._16_8_;
      uStack_1028 = local_1ba0._24_8_;
      auVar54._4_4_ = fStack_101c;
      auVar54._0_4_ = local_1020;
      auVar54._8_4_ = fStack_1018;
      auVar54._12_4_ = fStack_1014;
      auVar54._16_4_ = fStack_1010;
      auVar54._20_4_ = fStack_100c;
      auVar54._24_4_ = fStack_1008;
      auVar54._28_4_ = fStack_1004;
      _local_3700 = vpor_avx2(auVar54,local_1ba0);
      local_3720._0_4_ = local_38a0._0_4_;
      local_3720._4_4_ = local_38a0._4_4_;
      uStack_3718._0_4_ = local_38a0._8_4_;
      uStack_3718._4_4_ = local_38a0._12_4_;
      uStack_3710._0_4_ = local_38a0._16_4_;
      uStack_3710._4_4_ = local_38a0._20_4_;
      uStack_3708._0_4_ = local_38a0._24_4_;
      uStack_3708._4_4_ = local_38a0._28_4_;
      local_38c0 = (float)local_3700._0_4_ + (float)local_3720;
      fStack_38bc = (float)local_3700._4_4_ + local_3720._4_4_;
      fStack_38b8 = fStack_36f8 + (float)uStack_3718;
      fStack_38b4 = fStack_36f4 + uStack_3718._4_4_;
      fStack_38b0 = fStack_36f0 + (float)uStack_3710;
      fStack_38ac = fStack_36ec + uStack_3710._4_4_;
      fStack_38a8 = fStack_36e8 + (float)uStack_3708;
      fStack_38a4 = fStack_36e4 + uStack_3708._4_4_;
      local_3260 = local_3860._0_8_;
      uStack_3258 = local_3860._8_8_;
      uStack_3250 = local_3860._16_8_;
      uStack_3248 = local_3860._24_8_;
      local_3280 = local_3640._0_8_;
      uStack_3278 = local_3640._8_8_;
      uStack_3270 = auStack_3630._0_8_;
      uStack_3268 = auStack_3630._8_8_;
      auVar31._16_8_ = auStack_3630._0_8_;
      auVar31._0_16_ = local_3640;
      auVar31._24_8_ = auStack_3630._8_8_;
      auVar124 = vpor_avx2(local_3860,auVar31);
      auVar14._16_8_ = auStack_36b0._0_8_;
      auVar14._0_16_ = local_36c0;
      auVar14._24_8_ = auStack_36b0._8_8_;
      local_38e0 = vcmpps_avx(auVar124,auVar14,1);
      local_34e0 = local_3820._0_8_;
      uStack_34d8 = local_3820._8_8_;
      uStack_34d0 = local_3820._16_8_;
      uStack_34c8 = local_3820._24_8_;
      local_32a0 = local_3880._0_8_;
      uStack_3298 = local_3880._8_8_;
      uStack_3290 = local_3880._16_8_;
      uStack_3288 = local_3880._24_8_;
      local_32c0 = local_3600._0_8_;
      uStack_32b8 = local_3600._8_8_;
      uStack_32b0 = auStack_35f0._0_8_;
      uStack_32a8 = auStack_35f0._8_8_;
      auVar30._16_8_ = auStack_35f0._0_8_;
      auVar30._0_16_ = local_3600;
      auVar30._24_8_ = auStack_35f0._8_8_;
      local_3500 = vpor_avx2(local_3880,auVar30);
      local_3320 = vpand_avx2(local_3820,local_3500);
      local_ce0 = local_3820._0_8_;
      uStack_cd8 = local_3820._8_8_;
      uStack_cd0 = local_3820._16_8_;
      uStack_cc8 = local_3820._24_8_;
      local_3520 = local_38e0._0_8_;
      uStack_3518 = local_38e0._8_8_;
      uStack_3510 = local_38e0._16_8_;
      uStack_3508 = local_38e0._24_8_;
      local_3540 = local_3640._0_8_;
      uStack_3538 = local_3640._8_8_;
      uStack_3530 = auStack_3630._0_8_;
      uStack_3528 = auStack_3630._8_8_;
      auVar16._16_8_ = auStack_3630._0_8_;
      auVar16._0_16_ = local_3640;
      auVar16._24_8_ = auStack_3630._8_8_;
      local_32e0 = vpand_avx2(local_38e0,auVar16);
      local_ca0 = local_38e0._0_8_;
      uStack_c98 = local_38e0._8_8_;
      uStack_c90 = local_38e0._16_8_;
      uStack_c88 = local_38e0._24_8_;
      local_cc0 = local_36c0._0_8_;
      uStack_cb8 = local_36c0._8_8_;
      uStack_cb0 = auStack_36b0._0_8_;
      uStack_ca8 = auStack_36b0._8_8_;
      auVar60._16_8_ = auStack_36b0._0_8_;
      auVar60._0_16_ = local_36c0;
      auVar60._24_8_ = auStack_36b0._8_8_;
      local_3300 = vpandn_avx2(local_38e0,auVar60);
      local_d00 = vpor_avx2(local_32e0,local_3300);
      local_3340 = vpandn_avx2(local_3820,local_d00);
      local_3900 = vpor_avx2(local_3320,local_3340);
      local_3560 = local_3840._0_8_;
      uStack_3558 = local_3840._8_8_;
      uStack_3550 = local_3840._16_8_;
      uStack_3548 = local_3840._24_8_;
      local_3580 = CONCAT44(fStack_38bc,local_38c0);
      uStack_3578 = CONCAT44(fStack_38b4,fStack_38b8);
      uStack_3570 = CONCAT44(fStack_38ac,fStack_38b0);
      uStack_3568 = CONCAT44(fStack_38a4,fStack_38a8);
      auVar15._8_8_ = uStack_3578;
      auVar15._0_8_ = local_3580;
      auVar15._16_8_ = uStack_3570;
      auVar15._24_8_ = uStack_3568;
      local_3360 = vpand_avx2(local_3840,auVar15);
      local_d20 = local_3840._0_8_;
      uStack_d18 = local_3840._8_8_;
      uStack_d10 = local_3840._16_8_;
      uStack_d08 = local_3840._24_8_;
      local_d40 = local_3900._0_8_;
      uStack_d38 = local_3900._8_8_;
      uStack_d30 = local_3900._16_8_;
      uStack_d28 = local_3900._24_8_;
      auVar124 = vpternlogq_avx512vl(local_3840,local_3840,local_3840,0xf);
      local_3380 = vpand_avx2(auVar124,local_3900);
      auVar124 = vpor_avx2(local_3360,local_3380);
      in_stack_ffffffffffffbf60 = auVar124._0_8_;
      in_stack_ffffffffffffbf68 = auVar124._8_8_;
      in_stack_ffffffffffffbf70 = auVar124._16_8_;
      in_stack_ffffffffffffbf78 = auVar124._24_8_;
      local_3c40 = local_3e30;
      *(undefined8 *)*local_3e30 = in_stack_ffffffffffffbf60;
      *(undefined8 *)(*local_3e30 + 8) = in_stack_ffffffffffffbf68;
      *(undefined8 *)(*local_3e30 + 0x10) = in_stack_ffffffffffffbf70;
      *(undefined8 *)(*local_3e30 + 0x18) = in_stack_ffffffffffffbf78;
      local_3e20 = local_3e20 + 1;
      local_3e28 = local_3e28 + 1;
      local_3e30 = (undefined1 (*) [64])(*local_3e30 + 0x20);
      in_stack_ffffffffffffbf80 = local_39e0._0_8_;
      in_stack_ffffffffffffbf88 = local_39e0._8_8_;
      in_stack_ffffffffffffbf90 = auStack_39d0._0_8_;
      in_stack_ffffffffffffbf98 = auStack_39d0._8_8_;
      local_3c60 = in_stack_ffffffffffffbf60;
      uStack_3c58 = in_stack_ffffffffffffbf68;
      uStack_3c50 = in_stack_ffffffffffffbf70;
      uStack_3c48 = in_stack_ffffffffffffbf78;
      local_39b0 = local_3a6c;
      local_39ac = local_3a6c;
      local_39a8 = local_3a6c;
      local_39a4 = local_3a6c;
      local_39a0 = local_3a6c;
      local_399c = local_3a6c;
      local_3998 = local_3a6c;
      local_3994 = local_3a6c;
      local_3740 = in_stack_ffffffffffffbfa0;
      uStack_3738 = in_stack_ffffffffffffbfa8;
      uStack_3730 = in_stack_ffffffffffffbfb0;
      local_3720 = local_38a0._0_8_;
      uStack_3718 = local_38a0._8_8_;
      uStack_3710 = local_38a0._16_8_;
      uStack_3708 = local_38a0._24_8_;
      local_369c = local_36a0;
      local_3698 = local_36a0;
      local_3694 = local_36a0;
      local_3690 = local_36a0;
      local_368c = local_36a0;
      local_3688 = local_36a0;
      local_3684 = local_36a0;
      local_365c = local_3660;
      local_3658 = local_3660;
      local_3654 = local_3660;
      local_3650 = local_3660;
      local_364c = local_3660;
      local_3648 = local_3660;
      local_3644 = local_3660;
      local_361c = local_3620;
      local_3618 = local_3620;
      local_3614 = local_3620;
      local_3610 = local_3620;
      local_360c = local_3620;
      local_3608 = local_3620;
      local_3604 = local_3620;
      local_35dc = local_35e0;
      local_35d8 = local_35e0;
      local_35d4 = local_35e0;
      local_35d0 = local_35e0;
      local_35cc = local_35e0;
      local_35c8 = local_35e0;
      local_35c4 = local_35e0;
      local_35c0 = local_3760;
      uStack_35b8 = uStack_3758;
      uStack_35b0 = uStack_3750;
      uStack_35a8 = uStack_3748;
      local_35a0 = in_stack_ffffffffffffbfa0;
      uStack_3598 = in_stack_ffffffffffffbfa8;
      uStack_3590 = in_stack_ffffffffffffbfb0;
      uStack_3588 = uStack_3728;
      local_3440 = in_stack_ffffffffffffbfa0;
      uStack_3438 = in_stack_ffffffffffffbfa8;
      uStack_3430 = in_stack_ffffffffffffbfb0;
      uStack_3428 = uStack_3728;
      local_3400 = local_3760;
      uStack_33f8 = uStack_3758;
      uStack_33f0 = uStack_3750;
      uStack_33e8 = uStack_3748;
      local_1d40 = ZEXT1632(auVar21);
      local_1d20 = ZEXT1632(auVar22);
      local_1d00 = ZEXT1632(auVar23);
      local_1ce0 = ZEXT1632(auVar24);
      local_1cc0 = ZEXT1632(auVar3);
      local_1ca0 = ZEXT1632(auVar20);
      local_1c80 = ZEXT1632(auVar123);
      local_1c60 = ZEXT1632(auVar25);
      local_191c = local_1920;
      local_1918 = local_1920;
      local_1914 = local_1920;
      local_1910 = local_1920;
      local_190c = local_1920;
      local_1908 = local_1920;
      local_1904 = local_1920;
      local_18dc = local_18e0;
      local_18d8 = local_18e0;
      local_18d4 = local_18e0;
      local_18d0 = local_18e0;
      local_18cc = local_18e0;
      local_18c8 = local_18e0;
      local_18c4 = local_18e0;
      local_189c = local_18a0;
      local_1898 = local_18a0;
      local_1894 = local_18a0;
      local_1890 = local_18a0;
      local_188c = local_18a0;
      local_1888 = local_18a0;
      local_1884 = local_18a0;
      local_185c = local_1860;
      local_1858 = local_1860;
      local_1854 = local_1860;
      local_1850 = local_1860;
      local_184c = local_1860;
      local_1848 = local_1860;
      local_1844 = local_1860;
      local_181c = local_1820;
      local_1818 = local_1820;
      local_1814 = local_1820;
      local_1810 = local_1820;
      local_180c = local_1820;
      local_1808 = local_1820;
      local_1804 = local_1820;
      local_17dc = local_17e0;
      local_17d8 = local_17e0;
      local_17d4 = local_17e0;
      local_17d0 = local_17e0;
      local_17cc = local_17e0;
      local_17c8 = local_17e0;
      local_17c4 = local_17e0;
      local_179c = local_17a0;
      local_1798 = local_17a0;
      local_1794 = local_17a0;
      local_1790 = local_17a0;
      local_178c = local_17a0;
      local_1788 = local_17a0;
      local_1784 = local_17a0;
      local_175c = local_1760;
      local_1758 = local_1760;
      local_1754 = local_1760;
      local_1750 = local_1760;
      local_174c = local_1760;
      local_1748 = local_1760;
      local_1744 = local_1760;
      local_171c = local_1720;
      local_1718 = local_1720;
      local_1714 = local_1720;
      local_1710 = local_1720;
      local_170c = local_1720;
      local_1708 = local_1720;
      local_1704 = local_1720;
      local_16dc = local_16e0;
      local_16d8 = local_16e0;
      local_16d4 = local_16e0;
      local_16d0 = local_16e0;
      local_16cc = local_16e0;
      local_16c8 = local_16e0;
      local_16c4 = local_16e0;
      local_169c = local_16a0;
      local_1698 = local_16a0;
      local_1694 = local_16a0;
      local_1690 = local_16a0;
      local_168c = local_16a0;
      local_1688 = local_16a0;
      local_1684 = local_16a0;
      local_165c = local_1660;
      local_1658 = local_1660;
      local_1654 = local_1660;
      local_1650 = local_1660;
      local_164c = local_1660;
      local_1648 = local_1660;
      local_1644 = local_1660;
      local_161c = local_1620;
      local_1618 = local_1620;
      local_1614 = local_1620;
      local_1610 = local_1620;
      local_160c = local_1620;
      local_1608 = local_1620;
      local_1604 = local_1620;
      local_15e0 = local_1c60._0_8_;
      uStack_15d8 = local_1c60._8_8_;
      local_15a0 = local_15c0;
      uStack_1598 = uStack_15b8;
      uStack_1590 = uStack_15b0;
      uStack_1588 = uStack_15a8;
      local_1560 = local_1580;
      uStack_1558 = uStack_1578;
      uStack_1550 = uStack_1570;
      uStack_1548 = uStack_1568;
      local_14c0 = local_14d8;
      local_14a8 = local_14d8;
      local_1490 = local_14d8;
      local_1478 = local_14d8;
      local_1460 = local_14d8;
      local_1448 = local_14d8;
    }
  }
  if (local_3e38 == 4) {
    for (iVar148 = 0; iVar148 + 3 < local_3e34; iVar148 = iVar148 + 4) {
      local_3e18 = local_3e20;
      uVar128 = *(undefined8 *)*local_3e20;
      uVar133 = *(undefined8 *)(*local_3e20 + 8);
      uVar138 = *(undefined8 *)(*local_3e20 + 0x10);
      uVar143 = *(undefined8 *)(*local_3e20 + 0x18);
      uVar144 = *(undefined8 *)local_3e20[1];
      uVar145 = *(undefined8 *)(local_3e20[1] + 8);
      uVar146 = *(undefined8 *)(local_3e20[1] + 0x10);
      uVar147 = *(undefined8 *)(local_3e20[1] + 0x18);
      local_3b50 = *local_3e28;
      local_4160 = CONCAT44(local_3b50,local_3b50);
      uStackY_4158 = CONCAT44(local_3b50,local_3b50);
      local_3b70 = local_3e28[1];
      uStackY_4150 = CONCAT44(local_3b70,local_3b70);
      uStackY_4148 = CONCAT44(local_3b70,local_3b70);
      local_3b90 = local_3e28[2];
      local_4180 = CONCAT44(local_3b90,local_3b90);
      uStackY_4178 = CONCAT44(local_3b90,local_3b90);
      local_3bb0 = local_3e28[3];
      uStackY_4170 = CONCAT44(local_3bb0,local_3bb0);
      uStackY_4168 = CONCAT44(local_3bb0,local_3bb0);
      auVar26._8_8_ = uStackY_4178;
      auVar26._0_8_ = local_4180;
      auVar26._16_8_ = uStackY_4170;
      auVar26._24_8_ = uStackY_4168;
      local_41c0 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT824(uStackY_4148,
                                                 CONCAT816(uStackY_4150,
                                                           CONCAT88(uStackY_4158,local_4160)))),
                              auVar26,1);
      local_3980 = &local_3e39;
      local_3988 = &local_4100;
      local_3990 = local_41c0;
      y_01[2] = (float)(int)in_stack_ffffffffffffbf80;
      y_01[3] = (float)(int)((ulong)in_stack_ffffffffffffbf80 >> 0x20);
      y_01[0] = (float)(int)in_stack_ffffffffffffbf78;
      y_01[1] = (float)(int)((ulong)in_stack_ffffffffffffbf78 >> 0x20);
      y_01[4] = (float)(int)in_stack_ffffffffffffbf88;
      y_01[5] = (float)(int)((ulong)in_stack_ffffffffffffbf88 >> 0x20);
      y_01[6] = (float)(int)in_stack_ffffffffffffbf90;
      y_01[7] = (float)(int)((ulong)in_stack_ffffffffffffbf90 >> 0x20);
      y_01[8] = (float)(int)in_stack_ffffffffffffbf98;
      y_01[9] = (float)(int)((ulong)in_stack_ffffffffffffbf98 >> 0x20);
      y_01[10] = (float)(int)in_stack_ffffffffffffbfa0;
      y_01[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbfa0 >> 0x20);
      y_01[0xc] = (float)(int)in_stack_ffffffffffffbfa8;
      y_01[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbfa8 >> 0x20);
      y_01[0xe] = (float)(int)in_stack_ffffffffffffbfb0;
      y_01[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbfb0 >> 0x20);
      x_01[2] = (float)in_stack_ffffffffffffbf40._0_4_;
      x_01[3] = (float)in_stack_ffffffffffffbf40._4_4_;
      x_01[4] = (float)in_stack_ffffffffffffbf40._8_4_;
      x_01[5] = (float)in_stack_ffffffffffffbf40._12_4_;
      x_01[6] = (float)in_stack_ffffffffffffbf40._16_4_;
      x_01[7] = (float)in_stack_ffffffffffffbf40._20_4_;
      x_01[8] = (float)in_stack_ffffffffffffbf40._24_4_;
      x_01[0] = (float)(int)uVar147;
      x_01[1] = (float)(int)((ulong)uVar147 >> 0x20);
      x_01[9] = (float)iVar148;
      x_01[10] = (float)(int)in_stack_ffffffffffffbf60;
      x_01[0xb] = (float)(int)((ulong)in_stack_ffffffffffffbf60 >> 0x20);
      x_01[0xc] = (float)(int)in_stack_ffffffffffffbf68;
      x_01[0xd] = (float)(int)((ulong)in_stack_ffffffffffffbf68 >> 0x20);
      x_01[0xe] = (float)(int)in_stack_ffffffffffffbf70;
      x_01[0xf] = (float)(int)((ulong)in_stack_ffffffffffffbf70 >> 0x20);
      local_4140 = uStackY_4170;
      uStackY_4138 = uStackY_4168;
      local_4130 = local_4180;
      uStackY_4128 = uStackY_4178;
      local_4120 = uStackY_4150;
      uStackY_4118 = uStackY_4148;
      local_4110 = local_4160;
      uStackY_4108 = uStackY_4158;
      local_4100 = uVar128;
      uStackY_40f8 = uVar133;
      uStackY_40f0 = uVar138;
      uStackY_40e8 = uVar143;
      uStackY_40e0 = uVar144;
      uStackY_40d8 = uVar145;
      uStackY_40d0 = uVar146;
      uStack_3bac = local_3bb0;
      uStack_3ba8 = local_3bb0;
      uStack_3ba4 = local_3bb0;
      local_3b94 = local_3bb0;
      uStack_3b8c = local_3b90;
      uStack_3b88 = local_3b90;
      uStack_3b84 = local_3b90;
      local_3b74 = local_3b90;
      uStack_3b6c = local_3b70;
      uStack_3b68 = local_3b70;
      uStack_3b64 = local_3b70;
      local_3b54 = local_3b70;
      uStack_3b4c = local_3b50;
      uStack_3b48 = local_3b50;
      uStack_3b44 = local_3b50;
      local_3b34 = local_3b50;
      local_3b20 = local_4180;
      uStack_3b18 = uStackY_4178;
      local_3b10 = local_4160;
      uStack_3b08 = uStackY_4158;
      local_3b00 = local_4160;
      uStack_3af8 = uStackY_4158;
      uStack_3af0 = uStackY_4150;
      uStack_3ae8 = uStackY_4148;
      atan2512_ps(y_01,x_01);
      local_3d88 = local_3e30;
      auVar27._8_8_ = uVar133;
      auVar27._0_8_ = uVar128;
      auVar27._16_8_ = uVar138;
      auVar27._24_8_ = uVar143;
      auVar27._32_8_ = uVar144;
      auVar27._40_8_ = uVar145;
      auVar27._48_8_ = uVar146;
      auVar27._56_8_ = uVar147;
      *local_3e30 = auVar27;
      local_3e20 = local_3e20 + 2;
      local_3e28 = local_3e28 + 4;
      local_3e30 = local_3e30 + 1;
      local_3e00 = uVar128;
      uStack_3df8 = uVar133;
      uStack_3df0 = uVar138;
      uStack_3de8 = uVar143;
      uStack_3de0 = uVar144;
      uStack_3dd8 = uVar145;
      uStack_3dd0 = uVar146;
      uStack_3dc8 = uVar147;
    }
    for (; iVar148 + 1 < local_3e34; iVar148 = iVar148 + 2) {
      uVar1 = *local_3e28;
      uVar138 = CONCAT44(uVar1,uVar1);
      uVar143 = CONCAT44(uVar1,uVar1);
      uVar1 = local_3e28[1];
      uVar128 = CONCAT44(uVar1,uVar1);
      uVar133 = CONCAT44(uVar1,uVar1);
      auVar67._8_8_ = uVar143;
      auVar67._0_8_ = uVar138;
      auVar67._16_8_ = uVar128;
      auVar67._24_8_ = uVar133;
      auVar66._8_8_ = uVar143;
      auVar66._0_8_ = uVar138;
      auVar66._16_8_ = uVar128;
      auVar66._24_8_ = uVar133;
      auVar65._8_8_ = uVar143;
      auVar65._0_8_ = uVar138;
      auVar65._16_8_ = uVar128;
      auVar65._24_8_ = uVar133;
      auVar64._8_8_ = uVar143;
      auVar64._0_8_ = uVar138;
      auVar64._16_8_ = uVar128;
      auVar64._24_8_ = uVar133;
      auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
      auVar20 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0),0x30);
      uStack_2fb0 = auVar20._0_8_;
      uStack_2fa8 = auVar20._8_8_;
      auVar20 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x80000000),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x80000000),0x30);
      auVar123 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar123 = vinsertps_avx(auVar123,ZEXT416(0x80000000),0x20);
      auVar123 = vinsertps_avx(auVar123,ZEXT416(0x80000000),0x30);
      uStack_2f70 = auVar123._0_8_;
      uStack_2f68 = auVar123._8_8_;
      auVar123 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar123 = vinsertps_avx(auVar123,ZEXT416(0x40490fdb),0x20);
      auVar123 = vinsertps_avx(auVar123,ZEXT416(0x40490fdb),0x30);
      auVar21 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x40490fdb),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x40490fdb),0x30);
      uStack_2f30 = auVar21._0_8_;
      uStack_2f28 = auVar21._8_8_;
      auVar21 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3fc90fdb),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3fc90fdb),0x30);
      uStack_2ef0 = auVar22._0_8_;
      uStack_2ee8 = auVar22._8_8_;
      auVar33._16_8_ = uStack_2fb0;
      auVar33._0_16_ = auVar3;
      auVar33._24_8_ = uStack_2fa8;
      auVar124 = vcmpps_avx(auVar64,auVar33,4);
      auVar34._16_8_ = uStack_2fb0;
      auVar34._0_16_ = auVar3;
      auVar34._24_8_ = uStack_2fa8;
      auVar2 = vcmpps_avx(*local_3e20,auVar34,4);
      auVar13 = vpand_avx2(auVar124,auVar2);
      auVar41._16_8_ = uStack_2f70;
      auVar41._0_16_ = auVar20;
      auVar41._24_8_ = uStack_2f68;
      auVar14 = vpand_avx2(auVar41,auVar65);
      auVar40._16_8_ = uStack_2f70;
      auVar40._0_16_ = auVar20;
      auVar40._24_8_ = uStack_2f68;
      auVar15 = vpand_avx2(auVar40,*local_3e20);
      auVar35._16_8_ = uStack_2fb0;
      auVar35._0_16_ = auVar3;
      auVar35._24_8_ = uStack_2fa8;
      auVar124 = vcmpps_avx(auVar66,auVar35,1);
      auVar125 = vcmpps_avx(*local_3e20,auVar35,1);
      auVar39._16_8_ = uStack_2f70;
      auVar39._0_16_ = auVar20;
      auVar39._24_8_ = uStack_2f68;
      auVar125 = vpand_avx2(auVar125,auVar39);
      auVar44._16_8_ = uStack_2f30;
      auVar44._0_16_ = auVar123;
      auVar44._24_8_ = uStack_2f28;
      auVar125 = vpor_avx2(auVar125,auVar44);
      auVar16 = vpand_avx2(auVar124,auVar125);
      auVar124 = vdivps_avx(*local_3e20,auVar67);
      auVar20 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x80000000),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x80000000),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x80000000),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x80000000),0x30);
      uStack_26f0 = auVar22._0_8_;
      uStack_26e8 = auVar22._8_8_;
      auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
      auVar23 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3f800000),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3f800000),0x30);
      uStack_26b0 = auVar23._0_8_;
      uStack_26a8 = auVar23._8_8_;
      auVar23 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbf800000),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbf800000),0x30);
      auVar24 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbf800000),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbf800000),0x30);
      uStack_2670 = auVar24._0_8_;
      uStack_2668 = auVar24._8_8_;
      auVar24 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3fc90fdb),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3fc90fdb),0x30);
      auVar25 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3fc90fdb),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3fc90fdb),0x30);
      uStack_2630 = auVar25._0_8_;
      uStack_2628 = auVar25._8_8_;
      auVar25 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3f800000),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3f800000),0x30);
      auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
      uStack_25f0 = auVar4._0_8_;
      uStack_25e8 = auVar4._8_8_;
      auVar4 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0xbeaaaa53),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0xbeaaaa53),0x30);
      auVar5 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0xbeaaaa53),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0xbeaaaa53),0x30);
      uStack_25b0 = auVar5._0_8_;
      uStack_25a8 = auVar5._8_8_;
      auVar5 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3e4cb974),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3e4cb974),0x30);
      auVar6 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3e4cb974),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3e4cb974),0x30);
      uStack_2570 = auVar6._0_8_;
      uStack_2568 = auVar6._8_8_;
      auVar6 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0xbe117200),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0xbe117200),0x30);
      auVar7 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0xbe117200),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0xbe117200),0x30);
      uStack_2530 = auVar7._0_8_;
      uStack_2528 = auVar7._8_8_;
      auVar7 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3dd9ed24),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3dd9ed24),0x30);
      auVar8 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3dd9ed24),0x20);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3dd9ed24),0x30);
      uStack_24f0 = auVar8._0_8_;
      uStack_24e8 = auVar8._8_8_;
      auVar8 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0xbd99b01e),0x20);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0xbd99b01e),0x30);
      auVar9 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbd99b01e),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbd99b01e),0x30);
      uStack_24b0 = auVar9._0_8_;
      uStack_24a8 = auVar9._8_8_;
      auVar9 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3d2edd4e),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3d2edd4e),0x30);
      auVar10 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3d2edd4e),0x20);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3d2edd4e),0x30);
      uStack_2470 = auVar10._0_8_;
      uStack_2468 = auVar10._8_8_;
      auVar10 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbc83a25c),0x20);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbc83a25c),0x30);
      auVar11 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar11 = vinsertps_avx(auVar11,ZEXT416(0xbc83a25c),0x20);
      auVar11 = vinsertps_avx(auVar11,ZEXT416(0xbc83a25c),0x30);
      uStack_2430 = auVar11._0_8_;
      uStack_2428 = auVar11._8_8_;
      auVar11 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3b3ac537),0x20);
      auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3b3ac537),0x30);
      auVar12 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3b3ac537),0x20);
      auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3b3ac537),0x30);
      uStack_23f0 = auVar12._0_8_;
      uStack_23e8 = auVar12._8_8_;
      auVar48._16_8_ = uStack_26f0;
      auVar48._0_16_ = auVar20;
      auVar48._24_8_ = uStack_26e8;
      auVar17 = vpand_avx2(auVar48,auVar124);
      auVar58._16_8_ = uStack_26f0;
      auVar58._0_16_ = auVar20;
      auVar58._24_8_ = uStack_26e8;
      auVar18 = vpandn_avx2(auVar58,auVar124);
      auVar45._16_8_ = uStack_26b0;
      auVar45._0_16_ = auVar22;
      auVar45._24_8_ = uStack_26a8;
      auVar124 = vcmpps_avx(auVar45,auVar18,1);
      auVar47._16_8_ = uStack_2670;
      auVar47._0_16_ = auVar23;
      auVar47._24_8_ = uStack_2668;
      auVar125 = vpand_avx2(auVar124,auVar47);
      auVar19 = vpandn_avx2(auVar124,auVar18);
      auVar19 = vpor_avx2(auVar125,auVar19);
      auVar125 = vpand_avx2(auVar124,auVar18);
      auVar57._16_8_ = uStack_26b0;
      auVar57._0_16_ = auVar22;
      auVar57._24_8_ = uStack_26a8;
      auVar18 = vpandn_avx2(auVar124,auVar57);
      auVar125 = vpor_avx2(auVar125,auVar18);
      auVar125 = vdivps_avx(auVar19,auVar125);
      local_2320 = auVar125._0_4_;
      fStack_231c = auVar125._4_4_;
      fStack_2318 = auVar125._8_4_;
      fStack_2314 = auVar125._12_4_;
      fStack_2310 = auVar125._16_4_;
      fStack_230c = auVar125._20_4_;
      fStack_2308 = auVar125._24_4_;
      fStack_2304 = auVar125._28_4_;
      fVar126 = local_2320 * local_2320;
      fVar129 = fStack_231c * fStack_231c;
      fVar131 = fStack_2318 * fStack_2318;
      fVar134 = fStack_2314 * fStack_2314;
      fVar136 = fStack_2310 * fStack_2310;
      fVar139 = fStack_230c * fStack_230c;
      fVar141 = fStack_2308 * fStack_2308;
      fVar127 = fVar126 * fVar126;
      fVar130 = fVar129 * fVar129;
      fVar132 = fVar131 * fVar131;
      fVar135 = fVar134 * fVar134;
      fVar137 = fVar136 * fVar136;
      fVar140 = fVar139 * fVar139;
      fVar142 = fVar141 * fVar141;
      auVar72._4_4_ = fVar130;
      auVar72._0_4_ = fVar127;
      auVar72._8_4_ = fVar132;
      auVar72._12_4_ = fVar135;
      auVar72._16_4_ = fVar137;
      auVar72._20_4_ = fVar140;
      auVar72._24_4_ = fVar142;
      auVar72._28_4_ = fStack_2304;
      auVar81._16_8_ = uStack_2430;
      auVar81._0_16_ = auVar10;
      auVar81._24_8_ = uStack_2428;
      auVar83._16_8_ = uStack_24b0;
      auVar83._0_16_ = auVar8;
      auVar83._24_8_ = uStack_24a8;
      auVar20 = vfmadd213ps_fma(auVar81,auVar72,auVar83);
      auVar73._4_4_ = fVar130;
      auVar73._0_4_ = fVar127;
      auVar73._8_4_ = fVar132;
      auVar73._12_4_ = fVar135;
      auVar73._16_4_ = fVar137;
      auVar73._20_4_ = fVar140;
      auVar73._24_4_ = fVar142;
      auVar73._28_4_ = fStack_2304;
      auVar85._16_8_ = uStack_2530;
      auVar85._0_16_ = auVar6;
      auVar85._24_8_ = uStack_2528;
      auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar73,auVar85);
      auVar74._4_4_ = fVar130;
      auVar74._0_4_ = fVar127;
      auVar74._8_4_ = fVar132;
      auVar74._12_4_ = fVar135;
      auVar74._16_4_ = fVar137;
      auVar74._20_4_ = fVar140;
      auVar74._24_4_ = fVar142;
      auVar74._28_4_ = fStack_2304;
      auVar87._16_8_ = uStack_25b0;
      auVar87._0_16_ = auVar4;
      auVar87._24_8_ = uStack_25a8;
      auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar74,auVar87);
      auVar75._4_4_ = fVar130;
      auVar75._0_4_ = fVar127;
      auVar75._8_4_ = fVar132;
      auVar75._12_4_ = fVar135;
      auVar75._16_4_ = fVar137;
      auVar75._20_4_ = fVar140;
      auVar75._24_4_ = fVar142;
      auVar75._28_4_ = fStack_2304;
      auVar80._16_8_ = uStack_23f0;
      auVar80._0_16_ = auVar11;
      auVar80._24_8_ = uStack_23e8;
      auVar82._16_8_ = uStack_2470;
      auVar82._0_16_ = auVar9;
      auVar82._24_8_ = uStack_2468;
      auVar22 = vfmadd213ps_fma(auVar80,auVar75,auVar82);
      auVar76._4_4_ = fVar130;
      auVar76._0_4_ = fVar127;
      auVar76._8_4_ = fVar132;
      auVar76._12_4_ = fVar135;
      auVar76._16_4_ = fVar137;
      auVar76._20_4_ = fVar140;
      auVar76._24_4_ = fVar142;
      auVar76._28_4_ = fStack_2304;
      auVar84._16_8_ = uStack_24f0;
      auVar84._0_16_ = auVar7;
      auVar84._24_8_ = uStack_24e8;
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar76,auVar84);
      auVar77._4_4_ = fVar130;
      auVar77._0_4_ = fVar127;
      auVar77._8_4_ = fVar132;
      auVar77._12_4_ = fVar135;
      auVar77._16_4_ = fVar137;
      auVar77._20_4_ = fVar140;
      auVar77._24_4_ = fVar142;
      auVar77._28_4_ = fStack_2304;
      auVar86._16_8_ = uStack_2570;
      auVar86._0_16_ = auVar5;
      auVar86._24_8_ = uStack_2568;
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar77,auVar86);
      auVar78._4_4_ = fVar130;
      auVar78._0_4_ = fVar127;
      auVar78._8_4_ = fVar132;
      auVar78._12_4_ = fVar135;
      auVar78._16_4_ = fVar137;
      auVar78._20_4_ = fVar140;
      auVar78._24_4_ = fVar142;
      auVar78._28_4_ = fStack_2304;
      auVar88._16_8_ = uStack_25f0;
      auVar88._0_16_ = auVar25;
      auVar88._24_8_ = uStack_25e8;
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar78,auVar88);
      auVar79._4_4_ = fVar129;
      auVar79._0_4_ = fVar126;
      auVar79._8_4_ = fVar131;
      auVar79._12_4_ = fVar134;
      auVar79._16_4_ = fVar136;
      auVar79._20_4_ = fVar139;
      auVar79._24_4_ = fVar141;
      auVar79._28_4_ = fStack_2304;
      auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar79,ZEXT1632(auVar22));
      local_23a0 = auVar20._0_4_;
      fStack_239c = auVar20._4_4_;
      fStack_2398 = auVar20._8_4_;
      fStack_2394 = auVar20._12_4_;
      auVar46._16_8_ = uStack_2630;
      auVar46._0_16_ = auVar24;
      auVar46._24_8_ = uStack_2628;
      auVar124 = vpand_avx2(auVar124,auVar46);
      local_2780 = auVar124._0_4_;
      fStack_277c = auVar124._4_4_;
      fStack_2778 = auVar124._8_4_;
      fStack_2774 = auVar124._12_4_;
      fStack_2770 = auVar124._16_4_;
      fStack_276c = auVar124._20_4_;
      fStack_2768 = auVar124._24_4_;
      fStack_2764 = auVar124._28_4_;
      auVar49._4_4_ = fStack_239c * fStack_231c + fStack_277c;
      auVar49._0_4_ = local_23a0 * local_2320 + local_2780;
      auVar49._8_4_ = fStack_2398 * fStack_2318 + fStack_2778;
      auVar49._12_4_ = fStack_2394 * fStack_2314 + fStack_2774;
      auVar49._16_4_ = fStack_2310 * 0.0 + fStack_2770;
      auVar49._20_4_ = fStack_230c * 0.0 + fStack_276c;
      auVar49._24_4_ = fStack_2308 * 0.0 + fStack_2768;
      auVar49._28_4_ = fStack_2304 + fStack_2764;
      auVar124 = vpor_avx2(auVar49,auVar17);
      local_3000 = auVar124._0_4_;
      fStack_2ffc = auVar124._4_4_;
      fStack_2ff8 = auVar124._8_4_;
      fStack_2ff4 = auVar124._12_4_;
      fStack_2ff0 = auVar124._16_4_;
      fStack_2fec = auVar124._20_4_;
      fStack_2fe8 = auVar124._24_4_;
      fStack_2fe4 = auVar124._28_4_;
      local_3020 = auVar16._0_4_;
      fStack_301c = auVar16._4_4_;
      fStack_3018 = auVar16._8_4_;
      fStack_3014 = auVar16._12_4_;
      fStack_3010 = auVar16._16_4_;
      fStack_300c = auVar16._20_4_;
      fStack_3008 = auVar16._24_4_;
      fStack_3004 = auVar16._28_4_;
      auVar43._16_8_ = uStack_2f30;
      auVar43._0_16_ = auVar123;
      auVar43._24_8_ = uStack_2f28;
      auVar124 = vpor_avx2(auVar14,auVar43);
      auVar36._16_8_ = uStack_2fb0;
      auVar36._0_16_ = auVar3;
      auVar36._24_8_ = uStack_2fa8;
      auVar124 = vcmpps_avx(auVar124,auVar36,1);
      auVar42._16_8_ = uStack_2ef0;
      auVar42._0_16_ = auVar21;
      auVar42._24_8_ = uStack_2ee8;
      auVar125 = vpor_avx2(auVar15,auVar42);
      auVar125 = vpand_avx2(auVar2,auVar125);
      auVar38._16_8_ = uStack_2f30;
      auVar38._0_16_ = auVar123;
      auVar38._24_8_ = uStack_2f28;
      auVar14 = vpand_avx2(auVar124,auVar38);
      auVar59._16_8_ = uStack_2fb0;
      auVar59._0_16_ = auVar3;
      auVar59._24_8_ = uStack_2fa8;
      auVar124 = vpandn_avx2(auVar124,auVar59);
      auVar124 = vpor_avx2(auVar14,auVar124);
      auVar124 = vpandn_avx2(auVar2,auVar124);
      auVar2 = vpor_avx2(auVar125,auVar124);
      auVar37._4_4_ = fStack_2ffc + fStack_301c;
      auVar37._0_4_ = local_3000 + local_3020;
      auVar37._12_4_ = fStack_2ff4 + fStack_3014;
      auVar37._8_4_ = fStack_2ff8 + fStack_3018;
      auVar37._20_4_ = fStack_2fec + fStack_300c;
      auVar37._16_4_ = fStack_2ff0 + fStack_3010;
      auVar37._28_4_ = fStack_2fe4 + fStack_3004;
      auVar37._24_4_ = fStack_2fe8 + fStack_3008;
      auVar124 = vpand_avx2(auVar13,auVar37);
      auVar125 = vpternlogq_avx512vl(auVar13,auVar13,auVar13,0xf);
      auVar2 = vpand_avx2(auVar125,auVar2);
      auVar124 = vpor_avx2(auVar124,auVar2);
      local_4280 = auVar124._0_8_;
      uStackY_4278 = auVar124._8_8_;
      uStackY_4270 = auVar124._16_8_;
      uStackY_4268 = auVar124._24_8_;
      *(undefined8 *)*local_3e30 = local_4280;
      *(undefined8 *)(*local_3e30 + 8) = uStackY_4278;
      *(undefined8 *)(*local_3e30 + 0x10) = uStackY_4270;
      *(undefined8 *)(*local_3e30 + 0x18) = uStackY_4268;
      local_3e20 = local_3e20 + 1;
      local_3e28 = local_3e28 + 2;
      local_3e30 = (undefined1 (*) [64])(*local_3e30 + 0x20);
    }
    for (; iVar148 < local_3e34; iVar148 = iVar148 + 1) {
      uVar1 = *local_3e28;
      uVar128 = CONCAT44(uVar1,uVar1);
      uVar133 = CONCAT44(uVar1,uVar1);
      auVar63._8_8_ = uVar133;
      auVar63._0_8_ = uVar128;
      auVar62._8_8_ = uVar133;
      auVar62._0_8_ = uVar128;
      auVar61._8_8_ = uVar133;
      auVar61._0_8_ = uVar128;
      auVar20._8_8_ = uVar133;
      auVar20._0_8_ = uVar128;
      auVar3 = vcmpps_avx(auVar20,ZEXT816(0),4);
      auVar20 = vcmpps_avx(*(undefined1 (*) [16])*local_3e20,ZEXT816(0),4);
      auVar21 = vpand_avx(auVar3,auVar20);
      auVar23._8_8_ = 0x8000000080000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar22 = vpand_avx(auVar23,auVar61);
      auVar123._8_8_ = 0x8000000080000000;
      auVar123._0_8_ = 0x8000000080000000;
      auVar23 = vpand_avx(auVar123,*(undefined1 (*) [16])*local_3e20);
      auVar3 = vcmpps_avx(auVar62,ZEXT816(0),1);
      auVar123 = vcmpps_avx(*(undefined1 (*) [16])*local_3e20,ZEXT816(0),1);
      auVar24._8_8_ = 0x8000000080000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar123 = vpand_avx(auVar123,auVar24);
      auVar5._8_8_ = 0x40490fdb40490fdb;
      auVar5._0_8_ = 0x40490fdb40490fdb;
      auVar123 = vpor_avx(auVar123,auVar5);
      auVar24 = vpand_avx(auVar3,auVar123);
      auVar3 = vdivps_avx(*(undefined1 (*) [16])*local_3e20,auVar63);
      auVar8._8_8_ = 0x8000000080000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar25 = vpand_avx(auVar8,auVar3);
      auVar12._8_8_ = 0x8000000080000000;
      auVar12._0_8_ = 0x8000000080000000;
      auVar4 = vpandn_avx(auVar12,auVar3);
      auVar10._8_8_ = 0x3f8000003f800000;
      auVar10._0_8_ = 0x3f8000003f800000;
      auVar3 = vcmpps_avx(auVar10,auVar4,1);
      auVar7._8_8_ = 0xbf800000bf800000;
      auVar7._0_8_ = 0xbf800000bf800000;
      auVar123 = vpand_avx(auVar3,auVar7);
      auVar5 = vpandn_avx(auVar3,auVar4);
      auVar5 = vpor_avx(auVar123,auVar5);
      auVar123 = vpand_avx(auVar3,auVar4);
      auVar11._8_8_ = 0x3f8000003f800000;
      auVar11._0_8_ = 0x3f8000003f800000;
      auVar4 = vpandn_avx(auVar3,auVar11);
      auVar123 = vpor_avx(auVar123,auVar4);
      auVar123 = vdivps_avx(auVar5,auVar123);
      local_630 = auVar123._0_4_;
      fStack_62c = auVar123._4_4_;
      fStack_628 = auVar123._8_4_;
      fStack_624 = auVar123._12_4_;
      fVar126 = local_630 * local_630;
      fVar129 = fStack_62c * fStack_62c;
      fVar131 = fStack_628 * fStack_628;
      fVar134 = fStack_624 * fStack_624;
      fVar127 = fVar126 * fVar126;
      fVar130 = fVar129 * fVar129;
      fVar132 = fVar131 * fVar131;
      fVar135 = fVar134 * fVar134;
      auVar106._4_4_ = fVar130;
      auVar106._0_4_ = fVar127;
      auVar106._8_4_ = fVar132;
      auVar106._12_4_ = fVar135;
      auVar115._8_8_ = 0xbc83a25cbc83a25c;
      auVar115._0_8_ = 0xbc83a25cbc83a25c;
      auVar117._8_8_ = 0xbd99b01ebd99b01e;
      auVar117._0_8_ = 0xbd99b01ebd99b01e;
      auVar123 = vfmadd213ps_fma(auVar115,auVar106,auVar117);
      auVar107._4_4_ = fVar130;
      auVar107._0_4_ = fVar127;
      auVar107._8_4_ = fVar132;
      auVar107._12_4_ = fVar135;
      auVar119._8_8_ = 0xbe117200be117200;
      auVar119._0_8_ = 0xbe117200be117200;
      auVar123 = vfmadd213ps_fma(auVar123,auVar107,auVar119);
      auVar108._4_4_ = fVar130;
      auVar108._0_4_ = fVar127;
      auVar108._8_4_ = fVar132;
      auVar108._12_4_ = fVar135;
      auVar121._8_8_ = 0xbeaaaa53beaaaa53;
      auVar121._0_8_ = 0xbeaaaa53beaaaa53;
      auVar123 = vfmadd213ps_fma(auVar123,auVar108,auVar121);
      auVar109._4_4_ = fVar130;
      auVar109._0_4_ = fVar127;
      auVar109._8_4_ = fVar132;
      auVar109._12_4_ = fVar135;
      auVar114._8_8_ = 0x3b3ac5373b3ac537;
      auVar114._0_8_ = 0x3b3ac5373b3ac537;
      auVar116._8_8_ = 0x3d2edd4e3d2edd4e;
      auVar116._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar4 = vfmadd213ps_fma(auVar114,auVar109,auVar116);
      auVar110._4_4_ = fVar130;
      auVar110._0_4_ = fVar127;
      auVar110._8_4_ = fVar132;
      auVar110._12_4_ = fVar135;
      auVar118._8_8_ = 0x3dd9ed243dd9ed24;
      auVar118._0_8_ = 0x3dd9ed243dd9ed24;
      auVar4 = vfmadd213ps_fma(auVar4,auVar110,auVar118);
      auVar111._4_4_ = fVar130;
      auVar111._0_4_ = fVar127;
      auVar111._8_4_ = fVar132;
      auVar111._12_4_ = fVar135;
      auVar120._8_8_ = 0x3e4cb9743e4cb974;
      auVar120._0_8_ = 0x3e4cb9743e4cb974;
      auVar4 = vfmadd213ps_fma(auVar4,auVar111,auVar120);
      auVar112._4_4_ = fVar130;
      auVar112._0_4_ = fVar127;
      auVar112._8_4_ = fVar132;
      auVar112._12_4_ = fVar135;
      auVar122._8_8_ = 0x3f8000003f800000;
      auVar122._0_8_ = 0x3f8000003f800000;
      auVar4 = vfmadd213ps_fma(auVar4,auVar112,auVar122);
      auVar113._4_4_ = fVar129;
      auVar113._0_4_ = fVar126;
      auVar113._8_4_ = fVar131;
      auVar113._12_4_ = fVar134;
      auVar123 = vfmadd213ps_fma(auVar123,auVar113,auVar4);
      local_670 = auVar123._0_4_;
      fStack_66c = auVar123._4_4_;
      fStack_668 = auVar123._8_4_;
      fStack_664 = auVar123._12_4_;
      auVar6._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar6._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar3 = vpand_avx(auVar3,auVar6);
      local_6a0 = auVar3._0_4_;
      fStack_69c = auVar3._4_4_;
      fStack_698 = auVar3._8_4_;
      fStack_694 = auVar3._12_4_;
      auVar9._4_4_ = fStack_66c * fStack_62c + fStack_69c;
      auVar9._0_4_ = local_670 * local_630 + local_6a0;
      auVar9._8_4_ = fStack_668 * fStack_628 + fStack_698;
      auVar9._12_4_ = fStack_664 * fStack_624 + fStack_694;
      auVar3 = vpor_avx(auVar9,auVar25);
      local_b80 = auVar3._0_4_;
      fStack_b7c = auVar3._4_4_;
      fStack_b78 = auVar3._8_4_;
      fStack_b74 = auVar3._12_4_;
      local_b90 = auVar24._0_4_;
      fStack_b8c = auVar24._4_4_;
      fStack_b88 = auVar24._8_4_;
      fStack_b84 = auVar24._12_4_;
      auVar4._8_8_ = 0x40490fdb40490fdb;
      auVar4._0_8_ = 0x40490fdb40490fdb;
      auVar3 = vpor_avx(auVar22,auVar4);
      auVar3 = vcmpps_avx(auVar3,ZEXT816(0),1);
      auVar25._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar25._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar123 = vpor_avx(auVar23,auVar25);
      auVar123 = vpand_avx(auVar20,auVar123);
      auVar22._8_8_ = 0x40490fdb40490fdb;
      auVar22._0_8_ = 0x40490fdb40490fdb;
      auVar22 = vpand_avx(auVar3,auVar22);
      auVar3 = vpandn_avx(auVar3,ZEXT816(0));
      auVar3 = vpor_avx(auVar22,auVar3);
      auVar3 = vpandn_avx(auVar20,auVar3);
      auVar20 = vpor_avx(auVar123,auVar3);
      auVar3._4_4_ = fStack_b7c + fStack_b8c;
      auVar3._0_4_ = local_b80 + local_b90;
      auVar3._12_4_ = fStack_b74 + fStack_b84;
      auVar3._8_4_ = fStack_b78 + fStack_b88;
      auVar3 = vpand_avx(auVar21,auVar3);
      auVar123 = vpternlogq_avx512vl(auVar21,auVar21,auVar21,0xf);
      auVar20 = vpand_avx(auVar123,auVar20);
      auVar3 = vpor_avx(auVar3,auVar20);
      local_42b0 = auVar3._0_8_;
      uStackY_42a8 = auVar3._8_8_;
      *(undefined8 *)*local_3e30 = local_42b0;
      *(undefined8 *)(*local_3e30 + 8) = uStackY_42a8;
      local_3e20 = (undefined1 (*) [32])(*local_3e20 + 0x10);
      local_3e28 = local_3e28 + 1;
      local_3e30 = (undefined1 (*) [64])(*local_3e30 + 0x10);
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}